

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O1

void compute_response_layers_at_once(fasthessian *fh)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  response_layer *prVar13;
  response_layer *prVar14;
  response_layer *prVar15;
  response_layer *prVar16;
  response_layer *prVar17;
  response_layer *prVar18;
  response_layer *prVar19;
  response_layer *prVar20;
  integral_image *piVar21;
  float *pfVar22;
  bool *pbVar23;
  float *pfVar24;
  bool *pbVar25;
  float *pfVar26;
  bool *pbVar27;
  float *pfVar28;
  bool *pbVar29;
  float *pfVar30;
  bool *pbVar31;
  float *pfVar32;
  bool *pbVar33;
  float *pfVar34;
  bool *pbVar35;
  float *pfVar36;
  bool *pbVar37;
  float *pfVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  long lVar124;
  int width;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  int iVar159;
  int iVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  int iVar169;
  int iVar170;
  int iVar171;
  int iVar172;
  int iVar173;
  bool bVar174;
  int iVar175;
  int iVar176;
  int iVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  int iVar182;
  int iVar183;
  int iVar184;
  int iVar185;
  int iVar186;
  int iVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  int iVar192;
  bool bVar193;
  int iVar194;
  int iVar195;
  int iVar196;
  int c1;
  int iVar197;
  int iVar198;
  int iVar199;
  int iVar200;
  int iVar201;
  int iVar202;
  int iVar203;
  int iVar204;
  int iVar205;
  int iVar206;
  int iVar207;
  int iVar208;
  int iVar209;
  float *data;
  int iVar210;
  long lVar211;
  int iVar212;
  int c0;
  int iVar213;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar245 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  uint local_74c;
  int local_688;
  
  prVar13 = fh->response_map[0];
  uVar1 = prVar13->height;
  if (0 < (int)uVar1) {
    prVar14 = fh->response_map[1];
    prVar15 = fh->response_map[2];
    prVar16 = fh->response_map[3];
    prVar17 = fh->response_map[4];
    iVar2 = prVar13->filter_size;
    iVar3 = prVar14->filter_size;
    iVar4 = prVar15->filter_size;
    iVar5 = prVar16->filter_size;
    iVar43 = iVar2 / 3;
    iVar44 = iVar3 / 3;
    iVar45 = iVar4 / 3;
    iVar46 = iVar5 / 3;
    iVar6 = prVar17->filter_size;
    iVar47 = iVar6 / 3;
    prVar18 = fh->response_map[5];
    iVar7 = prVar18->filter_size;
    iVar48 = iVar7 / 3;
    prVar19 = fh->response_map[6];
    iVar8 = prVar19->filter_size;
    iVar49 = iVar8 / 3;
    prVar20 = fh->response_map[7];
    iVar9 = prVar20->filter_size;
    iVar50 = iVar9 / 3;
    iVar51 = iVar2 / 6;
    iVar52 = iVar3 / 6;
    iVar53 = iVar4 / 6;
    iVar54 = iVar5 / 6;
    iVar55 = iVar6 / 6;
    iVar56 = iVar7 / 6;
    iVar57 = iVar8 / 6;
    iVar58 = iVar9 / 6;
    iVar10 = fh->step;
    piVar21 = fh->iimage;
    pfVar22 = prVar14->response;
    pbVar23 = prVar14->laplacian;
    pfVar24 = prVar15->response;
    pbVar25 = prVar15->laplacian;
    pfVar26 = prVar16->response;
    pbVar27 = prVar16->laplacian;
    pfVar28 = prVar17->response;
    pbVar29 = prVar17->laplacian;
    pfVar30 = prVar18->response;
    pbVar31 = prVar18->laplacian;
    pfVar32 = prVar19->response;
    pbVar33 = prVar19->laplacian;
    pfVar34 = prVar20->response;
    pbVar35 = prVar20->laplacian;
    pfVar36 = prVar13->response;
    pbVar37 = prVar13->laplacian;
    iVar11 = prVar13->width;
    iVar208 = (iVar2 + -1) - (iVar2 + -1 >> 0x1f) >> 1;
    iVar96 = (iVar3 + -1) - (iVar3 + -1 >> 0x1f) >> 1;
    iVar125 = (iVar4 + -1) - (iVar4 + -1 >> 0x1f) >> 1;
    iVar181 = (iVar5 + -1) - (iVar5 + -1 >> 0x1f) >> 1;
    iVar186 = (iVar6 + -1) - (iVar6 + -1 >> 0x1f) >> 1;
    iVar194 = (iVar7 + -1) - (iVar7 + -1 >> 0x1f) >> 1;
    iVar197 = (iVar8 + -1) - (iVar8 + -1 >> 0x1f) >> 1;
    iVar93 = (iVar9 + -1) - (iVar9 + -1 >> 0x1f) >> 1;
    fVar237 = 1.0 / (float)(iVar2 * iVar2);
    fVar238 = 1.0 / (float)(iVar3 * iVar3);
    fVar239 = 1.0 / (float)(iVar4 * iVar4);
    fVar240 = 1.0 / (float)(iVar5 * iVar5);
    fVar241 = 1.0 / (float)(iVar6 * iVar6);
    fVar242 = 1.0 / (float)(iVar7 * iVar7);
    fVar243 = 1.0 / (float)(iVar8 * iVar8);
    fVar244 = 1.0 / (float)(iVar9 * iVar9);
    auVar245 = ZEXT816(0) << 0x40;
    iVar123 = 0;
    iVar122 = 0;
    local_688 = 0;
    local_74c = 0;
    do {
      if (0 < iVar11) {
        iVar126 = local_74c * iVar10;
        iVar182 = iVar126 - iVar43;
        iVar120 = piVar21->data_width;
        iVar12 = piVar21->height;
        iVar85 = iVar182 + 1;
        if (iVar12 < iVar182 + 1) {
          iVar85 = iVar12;
        }
        iVar97 = iVar43 * 2 + iVar182;
        if (iVar12 <= iVar97) {
          iVar97 = iVar12;
        }
        iVar187 = (iVar85 + -1) * iVar120;
        iVar98 = (iVar97 + -1) * iVar120;
        iVar99 = iVar126 - iVar208;
        iVar59 = iVar99;
        if (iVar12 < iVar99) {
          iVar59 = iVar12;
        }
        iVar60 = iVar99 + iVar2;
        if (iVar12 <= iVar99 + iVar2) {
          iVar60 = iVar12;
        }
        iVar188 = (iVar59 + -1) * iVar120;
        iVar100 = (iVar60 + -1) * iVar120;
        iVar101 = iVar126 - iVar51;
        iVar99 = iVar101;
        if (iVar12 < iVar101) {
          iVar99 = iVar12;
        }
        iVar61 = iVar101 + iVar43;
        if (iVar12 <= iVar101 + iVar43) {
          iVar61 = iVar12;
        }
        iVar189 = (iVar99 + -1) * iVar120;
        iVar101 = (iVar61 + -1) * iVar120;
        if (iVar12 < iVar182) {
          iVar182 = iVar12;
        }
        iVar62 = iVar12;
        if (iVar126 < iVar12) {
          iVar62 = iVar126;
        }
        iVar102 = (iVar182 + -1) * iVar120;
        iVar103 = (iVar62 + -1) * iVar120;
        iVar63 = iVar126 + 1;
        if (iVar12 < iVar126 + 1) {
          iVar63 = iVar12;
        }
        iVar183 = iVar126 + 1 + iVar43;
        if (iVar12 <= iVar183) {
          iVar183 = iVar12;
        }
        iVar104 = (iVar63 + -1) * iVar120;
        iVar105 = (iVar183 + -1) * iVar120;
        iVar106 = iVar126 + 1 + iVar44;
        iVar107 = iVar126 + 1 + iVar45;
        iVar108 = iVar126 + 1 + iVar46;
        iVar109 = iVar126 + 1 + iVar47;
        iVar110 = iVar126 + 1 + iVar48;
        iVar111 = iVar126 + 1 + iVar49;
        iVar112 = iVar126 + 1 + iVar50;
        iVar201 = iVar126 - iVar44;
        iVar86 = iVar201 + 1;
        if (iVar12 < iVar201 + 1) {
          iVar86 = iVar12;
        }
        iVar127 = iVar44 * 2 + iVar201;
        if (iVar12 <= iVar127) {
          iVar127 = iVar12;
        }
        iVar175 = (iVar86 + -1) * iVar120;
        iVar128 = (iVar127 + -1) * iVar120;
        iVar176 = iVar126 - iVar96;
        iVar64 = iVar176;
        if (iVar12 < iVar176) {
          iVar64 = iVar12;
        }
        iVar65 = iVar176 + iVar3;
        if (iVar12 <= iVar176 + iVar3) {
          iVar65 = iVar12;
        }
        iVar129 = (iVar64 + -1) * iVar120;
        iVar130 = (iVar65 + -1) * iVar120;
        iVar177 = iVar126 - iVar52;
        iVar176 = iVar177;
        if (iVar12 < iVar177) {
          iVar176 = iVar12;
        }
        iVar66 = iVar177 + iVar44;
        if (iVar12 <= iVar177 + iVar44) {
          iVar66 = iVar12;
        }
        iVar177 = (iVar176 + -1) * iVar120;
        iVar131 = (iVar66 + -1) * iVar120;
        if (iVar12 < iVar201) {
          iVar201 = iVar12;
        }
        iVar132 = (iVar201 + -1) * iVar120;
        if (iVar12 <= iVar106) {
          iVar106 = iVar12;
        }
        iVar133 = (iVar106 + -1) * iVar120;
        iVar178 = iVar126 - iVar45;
        iVar87 = iVar178 + 1;
        if (iVar12 < iVar178 + 1) {
          iVar87 = iVar12;
        }
        iVar134 = iVar45 * 2 + iVar178;
        if (iVar12 <= iVar134) {
          iVar134 = iVar12;
        }
        iVar202 = (iVar87 + -1) * iVar120;
        iVar135 = (iVar134 + -1) * iVar120;
        iVar203 = iVar126 - iVar125;
        iVar67 = iVar203;
        if (iVar12 < iVar203) {
          iVar67 = iVar12;
        }
        iVar68 = iVar203 + iVar4;
        if (iVar12 <= iVar203 + iVar4) {
          iVar68 = iVar12;
        }
        iVar136 = (iVar67 + -1) * iVar120;
        iVar137 = (iVar68 + -1) * iVar120;
        iVar113 = iVar126 - iVar53;
        iVar203 = iVar113;
        if (iVar12 < iVar113) {
          iVar203 = iVar12;
        }
        iVar69 = iVar113 + iVar45;
        if (iVar12 <= iVar113 + iVar45) {
          iVar69 = iVar12;
        }
        iVar113 = (iVar203 + -1) * iVar120;
        iVar138 = (iVar69 + -1) * iVar120;
        if (iVar12 < iVar178) {
          iVar178 = iVar12;
        }
        iVar139 = (iVar178 + -1) * iVar120;
        if (iVar12 <= iVar107) {
          iVar107 = iVar12;
        }
        iVar140 = (iVar107 + -1) * iVar120;
        iVar179 = iVar126 - iVar46;
        iVar88 = iVar179 + 1;
        if (iVar12 < iVar179 + 1) {
          iVar88 = iVar12;
        }
        iVar141 = iVar46 * 2 + iVar179;
        if (iVar12 <= iVar141) {
          iVar141 = iVar12;
        }
        iVar204 = (iVar88 + -1) * iVar120;
        iVar142 = (iVar141 + -1) * iVar120;
        iVar114 = iVar126 - iVar181;
        iVar70 = iVar114;
        if (iVar12 < iVar114) {
          iVar70 = iVar12;
        }
        iVar71 = iVar114 + iVar5;
        if (iVar12 <= iVar114 + iVar5) {
          iVar71 = iVar12;
        }
        iVar143 = (iVar70 + -1) * iVar120;
        iVar144 = (iVar71 + -1) * iVar120;
        iVar115 = iVar126 - iVar54;
        iVar114 = iVar115;
        if (iVar12 < iVar115) {
          iVar114 = iVar12;
        }
        iVar72 = iVar115 + iVar46;
        if (iVar12 <= iVar115 + iVar46) {
          iVar72 = iVar12;
        }
        iVar115 = (iVar114 + -1) * iVar120;
        iVar145 = (iVar72 + -1) * iVar120;
        if (iVar12 < iVar179) {
          iVar179 = iVar12;
        }
        iVar146 = (iVar179 + -1) * iVar120;
        if (iVar12 <= iVar108) {
          iVar108 = iVar12;
        }
        iVar147 = (iVar108 + -1) * iVar120;
        iVar116 = iVar126 - iVar47;
        iVar89 = iVar116 + 1;
        if (iVar12 < iVar116 + 1) {
          iVar89 = iVar12;
        }
        iVar148 = iVar47 * 2 + iVar116;
        if (iVar12 <= iVar148) {
          iVar148 = iVar12;
        }
        iVar205 = (iVar89 + -1) * iVar120;
        iVar149 = (iVar148 + -1) * iVar120;
        iVar180 = iVar126 - iVar186;
        iVar73 = iVar180;
        if (iVar12 < iVar180) {
          iVar73 = iVar12;
        }
        iVar74 = iVar180 + iVar6;
        if (iVar12 <= iVar180 + iVar6) {
          iVar74 = iVar12;
        }
        iVar150 = (iVar73 + -1) * iVar120;
        iVar151 = (iVar74 + -1) * iVar120;
        iVar212 = iVar126 - iVar55;
        iVar180 = iVar212;
        if (iVar12 < iVar212) {
          iVar180 = iVar12;
        }
        iVar75 = iVar212 + iVar47;
        if (iVar12 <= iVar212 + iVar47) {
          iVar75 = iVar12;
        }
        iVar212 = (iVar180 + -1) * iVar120;
        iVar152 = (iVar75 + -1) * iVar120;
        if (iVar12 < iVar116) {
          iVar116 = iVar12;
        }
        iVar153 = (iVar116 + -1) * iVar120;
        if (iVar12 <= iVar109) {
          iVar109 = iVar12;
        }
        iVar154 = (iVar109 + -1) * iVar120;
        iVar117 = iVar126 - iVar48;
        iVar90 = iVar117 + 1;
        if (iVar12 < iVar117 + 1) {
          iVar90 = iVar12;
        }
        iVar155 = iVar48 * 2 + iVar117;
        if (iVar12 <= iVar155) {
          iVar155 = iVar12;
        }
        iVar206 = (iVar90 + -1) * iVar120;
        iVar156 = (iVar155 + -1) * iVar120;
        iVar210 = iVar126 - iVar194;
        iVar76 = iVar210;
        if (iVar12 < iVar210) {
          iVar76 = iVar12;
        }
        iVar77 = iVar210 + iVar7;
        if (iVar12 <= iVar210 + iVar7) {
          iVar77 = iVar12;
        }
        iVar157 = (iVar76 + -1) * iVar120;
        iVar158 = (iVar77 + -1) * iVar120;
        iVar198 = iVar126 - iVar56;
        iVar210 = iVar198;
        if (iVar12 < iVar198) {
          iVar210 = iVar12;
        }
        iVar78 = iVar198 + iVar48;
        if (iVar12 <= iVar198 + iVar48) {
          iVar78 = iVar12;
        }
        iVar198 = (iVar210 + -1) * iVar120;
        iVar159 = (iVar78 + -1) * iVar120;
        if (iVar12 < iVar117) {
          iVar117 = iVar12;
        }
        iVar160 = (iVar117 + -1) * iVar120;
        if (iVar12 <= iVar110) {
          iVar110 = iVar12;
        }
        iVar161 = (iVar110 + -1) * iVar120;
        iVar118 = iVar126 - iVar49;
        iVar91 = iVar118 + 1;
        if (iVar12 < iVar118 + 1) {
          iVar91 = iVar12;
        }
        iVar162 = iVar49 * 2 + iVar118;
        if (iVar12 <= iVar162) {
          iVar162 = iVar12;
        }
        iVar199 = (iVar91 + -1) * iVar120;
        iVar163 = (iVar162 + -1) * iVar120;
        iVar213 = iVar126 - iVar197;
        iVar79 = iVar213;
        if (iVar12 < iVar213) {
          iVar79 = iVar12;
        }
        iVar80 = iVar213 + iVar8;
        if (iVar12 <= iVar213 + iVar8) {
          iVar80 = iVar12;
        }
        iVar164 = (iVar79 + -1) * iVar120;
        iVar165 = (iVar80 + -1) * iVar120;
        iVar190 = iVar126 - iVar57;
        iVar213 = iVar190;
        if (iVar12 < iVar190) {
          iVar213 = iVar12;
        }
        iVar81 = iVar190 + iVar49;
        if (iVar12 <= iVar190 + iVar49) {
          iVar81 = iVar12;
        }
        iVar190 = (iVar213 + -1) * iVar120;
        iVar166 = (iVar81 + -1) * iVar120;
        if (iVar12 < iVar118) {
          iVar118 = iVar12;
        }
        iVar167 = (iVar118 + -1) * iVar120;
        if (iVar12 <= iVar111) {
          iVar111 = iVar12;
        }
        iVar168 = (iVar111 + -1) * iVar120;
        iVar184 = iVar126 - iVar50;
        iVar92 = iVar184 + 1;
        if (iVar12 < iVar184 + 1) {
          iVar92 = iVar12;
        }
        iVar169 = iVar50 * 2 + iVar184;
        if (iVar12 <= iVar169) {
          iVar169 = iVar12;
        }
        iVar191 = (iVar92 + -1) * iVar120;
        iVar170 = (iVar169 + -1) * iVar120;
        iVar209 = iVar126 - iVar93;
        iVar82 = iVar209;
        if (iVar12 < iVar209) {
          iVar82 = iVar12;
        }
        iVar83 = iVar209 + iVar9;
        if (iVar12 <= iVar209 + iVar9) {
          iVar83 = iVar12;
        }
        iVar171 = (iVar82 + -1) * iVar120;
        iVar172 = (iVar83 + -1) * iVar120;
        iVar126 = iVar126 - iVar58;
        iVar209 = iVar126;
        if (iVar12 < iVar126) {
          iVar209 = iVar12;
        }
        iVar84 = iVar126 + iVar50;
        if (iVar12 <= iVar126 + iVar50) {
          iVar84 = iVar12;
        }
        iVar173 = (iVar209 + -1) * iVar120;
        iVar126 = (iVar84 + -1) * iVar120;
        if (iVar12 < iVar184) {
          iVar184 = iVar12;
        }
        iVar119 = (iVar184 + -1) * iVar120;
        if (iVar112 < iVar12) {
          iVar12 = iVar112;
        }
        iVar120 = (iVar12 + -1) * iVar120;
        lVar124 = (long)local_688;
        pfVar38 = piVar21->data;
        iVar112 = piVar21->width;
        iVar192 = 0;
        lVar211 = 0;
        do {
          iVar185 = iVar192 - iVar208;
          if (iVar112 < iVar192 - iVar208) {
            iVar185 = iVar112;
          }
          iVar94 = (iVar2 - iVar208) + iVar192;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          fVar246 = 0.0;
          fVar248 = 0.0;
          if ((0 < iVar85) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar187 + iVar185 + -1];
          }
          if ((0 < iVar85) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar187 + iVar94 + -1];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar97) && (0 < iVar185)) {
            fVar249 = pfVar38[iVar185 + -1 + iVar98];
          }
          if ((0 < iVar97) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar94 + -1 + iVar98];
          }
          iVar185 = iVar192 - iVar51;
          if (iVar112 < iVar192 - iVar51) {
            iVar185 = iVar112;
          }
          iVar94 = (iVar43 - iVar51) + iVar192;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          auVar214 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar219 = ZEXT816(0) << 0x40;
          if ((0 < iVar85) && (0 < iVar185)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar187 + iVar185 + -1]);
          }
          auVar215 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          if ((0 < iVar85) && (0 < iVar94)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar187 + iVar94 + -1]);
          }
          auVar216 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar217 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          if ((0 < iVar97) && (0 < iVar185)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar185 + -1 + iVar98]);
          }
          if ((0 < iVar97) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar98]);
          }
          auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                    auVar214);
          iVar185 = -iVar43 + 1 + iVar192;
          if (iVar112 < iVar185) {
            iVar185 = iVar112;
          }
          iVar121 = iVar185 + -1;
          iVar94 = iVar43 + iVar192;
          if (iVar112 <= iVar43 + iVar192) {
            iVar94 = iVar112;
          }
          auVar219 = vsubss_avx512f(auVar219,auVar215);
          auVar219 = vsubss_avx512f(auVar219,auVar217);
          auVar219 = vaddss_avx512f(auVar219,auVar216);
          fVar246 = 0.0;
          auVar219 = vmaxss_avx(auVar219,ZEXT816(0) << 0x40);
          auVar236 = SUB6416(ZEXT464(0xc0400000),0);
          auVar219 = vfmadd132ss_fma(auVar219,auVar218,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar59) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar188 + iVar121];
          }
          iVar195 = iVar94 + -1;
          if ((0 < iVar59) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar188 + iVar195];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar60) && (0 < iVar185)) {
            fVar249 = pfVar38[iVar100 + iVar121];
          }
          if ((0 < iVar60) && (0 < iVar94)) {
            fVar247 = pfVar38[iVar100 + iVar195];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          if ((0 < iVar99) && (0 < iVar185)) {
            auVar214 = ZEXT416((uint)pfVar38[iVar189 + iVar121]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar99) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar189 + iVar195]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          auVar218 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          if ((0 < iVar61) && (0 < iVar185)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar121 + iVar101]);
          }
          if ((0 < iVar61) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar195 + iVar101]);
          }
          auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                    auVar215);
          iVar185 = iVar192 + 1;
          if (iVar112 < iVar192 + 1) {
            iVar185 = iVar112;
          }
          iVar121 = iVar185 + -1;
          iVar94 = iVar192 + 1 + iVar43;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          auVar221 = vsubss_avx512f(auVar214,auVar216);
          auVar221 = vsubss_avx512f(auVar221,auVar218);
          auVar221 = vaddss_avx512f(auVar221,auVar217);
          fVar246 = 0.0;
          auVar221 = vmaxss_avx(auVar221,ZEXT816(0) << 0x40);
          auVar220 = vfmadd132ss_fma(auVar221,auVar220,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar182) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar102 + iVar121];
          }
          iVar195 = iVar94 + -1;
          if ((0 < iVar182) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar102 + iVar195];
          }
          bVar193 = 0 < iVar62 && 0 < iVar185;
          fVar249 = 0.0;
          auVar214 = vxorps_avx512vl(auVar214,auVar214);
          if (0 < iVar62 && 0 < iVar185) {
            auVar214 = ZEXT416((uint)pfVar38[iVar103 + iVar121]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar103 + iVar195];
          }
          iVar196 = -iVar43 + iVar192;
          if (iVar112 < iVar196) {
            iVar196 = iVar112;
          }
          iVar95 = iVar196 + -1;
          iVar207 = iVar112;
          if (iVar192 < iVar112) {
            iVar207 = iVar192;
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar63) && (0 < iVar196)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
          }
          iVar200 = iVar207 + -1;
          bVar174 = 0 < iVar207 && 0 < iVar63;
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if (0 < iVar207 && 0 < iVar63) {
            auVar217 = ZEXT416((uint)pfVar38[iVar104 + iVar200]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          auVar221 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          if ((0 < iVar183) && (0 < iVar196)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar105 + iVar95]);
          }
          if ((0 < iVar183) && (0 < iVar207)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar105 + iVar200]);
          }
          auVar222 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar222);
          auVar223 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          if ((0 < iVar182) && (0 < iVar196)) {
            auVar223 = ZEXT416((uint)pfVar38[iVar102 + iVar95]);
          }
          auVar224 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          if ((0 < iVar182) && (0 < iVar207)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar102 + iVar200]);
          }
          auVar225 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
          auVar226 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
          if ((0 < iVar62) && (0 < iVar196)) {
            auVar226 = ZEXT416((uint)pfVar38[iVar95 + iVar103]);
          }
          bVar39 = 0 < iVar207;
          bVar40 = 0 < iVar62;
          if (bVar40 && bVar39) {
            auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar200]);
          }
          bVar41 = 0 < iVar185;
          bVar42 = 0 < iVar63;
          auVar227 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
          in_ZMM27 = ZEXT1664(auVar227);
          auVar228 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
          if (bVar42 && bVar41) {
            auVar228 = ZEXT416((uint)pfVar38[iVar104 + iVar121]);
          }
          auVar229 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar229 = ZEXT416((uint)pfVar38[iVar104 + iVar195]);
          }
          auVar230 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
          auVar231 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
          if ((0 < iVar183) && (0 < iVar185)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar105 + iVar121]);
          }
          if ((0 < iVar183) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar195 + iVar105]);
          }
          auVar232 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar214);
          auVar233 = vmaxss_avx512f(ZEXT416((uint)(auVar232._0_4_ + fVar249)),auVar215);
          auVar232 = vsubss_avx512f(auVar216,auVar217);
          auVar232 = vsubss_avx512f(auVar232,auVar221);
          auVar232 = vaddss_avx512f(auVar232,auVar218);
          auVar234 = vmaxss_avx512f(auVar232,auVar222);
          auVar232 = vsubss_avx512f(auVar223,auVar224);
          auVar232 = vsubss_avx512f(auVar232,auVar226);
          auVar232 = vaddss_avx512f(auVar232,auVar225);
          auVar235 = vmaxss_avx512f(auVar232,auVar227);
          auVar232 = vsubss_avx512f(auVar228,auVar229);
          auVar232 = vsubss_avx512f(auVar232,auVar231);
          auVar232 = vaddss_avx512f(auVar232,auVar230);
          fVar248 = 0.0;
          auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x20);
          fVar246 = ((auVar233._0_4_ + auVar234._0_4_) - auVar235._0_4_) - auVar232._0_4_;
          auVar232 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -0.81)),auVar219,auVar220);
          pfVar36[lVar124 + lVar211] = auVar232._0_4_ * fVar237 * fVar237;
          pbVar37[lVar211 + lVar124] = 0.0 <= auVar219._0_4_ + auVar220._0_4_;
          iVar94 = iVar192 - iVar96;
          if (iVar112 < iVar192 - iVar96) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar3 - iVar96) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          fVar246 = 0.0;
          if ((0 < iVar86) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar175 + iVar94 + -1];
          }
          if ((0 < iVar86) && (0 < iVar195)) {
            fVar248 = pfVar38[iVar175 + iVar195 + -1];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar127) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar94 + -1 + iVar128];
          }
          if ((0 < iVar127) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar195 + -1 + iVar128];
          }
          iVar94 = iVar192 - iVar52;
          if (iVar112 < iVar192 - iVar52) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar44 - iVar52) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          auVar214 = vxorps_avx512vl(auVar214,auVar214);
          auVar219._0_12_ = ZEXT812(0);
          auVar219._12_4_ = 0;
          if ((0 < iVar86) && (0 < iVar94)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar175 + iVar94 + -1]);
          }
          if ((0 < iVar86) && (0 < iVar195)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar175 + iVar195 + -1]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if ((0 < iVar127) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar128]);
          }
          if ((0 < iVar127) && (0 < iVar195)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar128]);
          }
          auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar246 - fVar248) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = -iVar44 + 1 + iVar192;
          if (iVar112 < iVar94) {
            iVar94 = iVar112;
          }
          iVar196 = iVar94 + -1;
          iVar195 = iVar44 + iVar192;
          if (iVar112 <= iVar44 + iVar192) {
            iVar195 = iVar112;
          }
          auVar219 = vsubss_avx512f(auVar219,auVar215);
          auVar219 = vsubss_avx512f(auVar219,auVar217);
          auVar219 = vaddss_avx512f(auVar219,auVar216);
          fVar246 = 0.0;
          auVar219 = vmaxss_avx(auVar219,ZEXT816(0) << 0x40);
          auVar219 = vfmadd132ss_fma(auVar219,auVar220,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar64) && (0 < iVar94)) {
            fVar248 = pfVar38[iVar129 + iVar196];
          }
          iVar95 = iVar195 + -1;
          if ((0 < iVar64) && (0 < iVar195)) {
            fVar246 = pfVar38[iVar129 + iVar95];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar65) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar130 + iVar196];
          }
          if ((0 < iVar65) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar130 + iVar95];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          if ((0 < iVar176) && (0 < iVar94)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar177 + iVar196]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar176) && (0 < iVar195)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar177 + iVar95]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          if ((0 < iVar66) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar131]);
          }
          if ((0 < iVar66) && (0 < iVar195)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar131]);
          }
          auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = iVar44 + 1 + iVar192;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          auVar232 = vsubss_avx512f(auVar215,auVar216);
          auVar232 = vsubss_avx512f(auVar232,auVar218);
          auVar232 = vaddss_avx512f(auVar232,auVar217);
          fVar246 = 0.0;
          auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x40);
          auVar220 = vfmadd132ss_fma(auVar232,auVar220,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar201) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar132 + iVar121];
          }
          iVar195 = iVar94 + -1;
          if ((0 < iVar201) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar132 + iVar195];
          }
          fVar249 = 0.0;
          if (bVar193) {
            auVar214 = ZEXT416((uint)pfVar38[iVar103 + iVar121]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar103 + iVar195];
          }
          iVar196 = -iVar44 + iVar192;
          if (iVar112 < iVar196) {
            iVar196 = iVar112;
          }
          iVar95 = iVar196 + -1;
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar63) && (0 < iVar196)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
          }
          auVar217 = vxorps_avx512vl(auVar217,auVar217);
          if (bVar174) {
            auVar217 = ZEXT416((uint)pfVar38[iVar104 + iVar200]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          auVar221 = vxorps_avx512vl(auVar221,auVar221);
          if ((0 < iVar106) && (0 < iVar196)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar133 + iVar95]);
          }
          if ((0 < iVar106) && (0 < iVar207)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar133 + iVar200]);
          }
          auVar223 = vxorps_avx512vl(auVar223,auVar223);
          if ((0 < iVar201) && (0 < iVar196)) {
            auVar223 = ZEXT416((uint)pfVar38[iVar132 + iVar95]);
          }
          auVar224 = vxorps_avx512vl(auVar224,auVar224);
          if ((0 < iVar201) && (0 < iVar207)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar132 + iVar200]);
          }
          auVar225 = vxorps_avx512vl(auVar225,auVar225);
          auVar226 = vxorps_avx512vl(auVar226,auVar226);
          if ((0 < iVar62) && (0 < iVar196)) {
            auVar226 = ZEXT416((uint)pfVar38[iVar95 + iVar103]);
          }
          if (bVar40 && bVar39) {
            auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar200]);
          }
          auVar228 = vxorps_avx512vl(auVar228,auVar228);
          if (bVar42 && bVar41) {
            auVar228 = ZEXT416((uint)pfVar38[iVar104 + iVar121]);
          }
          auVar229 = vxorps_avx512vl(auVar229,auVar229);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar229 = ZEXT416((uint)pfVar38[iVar104 + iVar195]);
          }
          auVar230 = vxorps_avx512vl(auVar230,auVar230);
          auVar231 = vxorps_avx512vl(auVar231,auVar231);
          if ((0 < iVar106) && (0 < iVar185)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar133 + iVar121]);
          }
          if ((0 < iVar106) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar195 + iVar133]);
          }
          auVar232 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar214);
          auVar233 = vmaxss_avx512f(ZEXT416((uint)(auVar232._0_4_ + fVar249)),auVar215);
          auVar232 = vsubss_avx512f(auVar216,auVar217);
          auVar232 = vsubss_avx512f(auVar232,auVar221);
          auVar232 = vaddss_avx512f(auVar232,auVar218);
          auVar234 = vmaxss_avx512f(auVar232,auVar222);
          auVar232 = vsubss_avx512f(auVar223,auVar224);
          auVar232 = vsubss_avx512f(auVar232,auVar226);
          auVar232 = vaddss_avx512f(auVar232,auVar225);
          auVar235 = vmaxss_avx512f(auVar232,auVar227);
          auVar232 = vsubss_avx512f(auVar228,auVar229);
          auVar232 = vsubss_avx512f(auVar232,auVar231);
          auVar232 = vaddss_avx512f(auVar232,auVar230);
          fVar248 = 0.0;
          auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x20);
          fVar246 = ((auVar233._0_4_ + auVar234._0_4_) - auVar235._0_4_) - auVar232._0_4_;
          auVar232 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -0.81)),auVar219,auVar220);
          pfVar22[lVar124 + lVar211] = auVar232._0_4_ * fVar238 * fVar238;
          pbVar23[lVar211 + lVar124] = 0.0 <= auVar219._0_4_ + auVar220._0_4_;
          iVar94 = iVar192 - iVar125;
          if (iVar112 < iVar192 - iVar125) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar4 - iVar125) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          fVar246 = 0.0;
          if ((0 < iVar87) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar202 + iVar94 + -1];
          }
          if ((0 < iVar87) && (0 < iVar195)) {
            fVar248 = pfVar38[iVar202 + iVar195 + -1];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar134) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar94 + -1 + iVar135];
          }
          if ((0 < iVar134) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar195 + -1 + iVar135];
          }
          iVar94 = iVar192 - iVar53;
          if (iVar112 < iVar192 - iVar53) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar45 - iVar53) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          auVar214 = vxorps_avx512vl(auVar214,auVar214);
          auVar220._0_12_ = ZEXT812(0);
          auVar220._12_4_ = 0;
          if ((0 < iVar87) && (0 < iVar94)) {
            auVar220 = ZEXT416((uint)pfVar38[iVar202 + iVar94 + -1]);
          }
          if ((0 < iVar87) && (0 < iVar195)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar202 + iVar195 + -1]);
          }
          auVar219 = vxorps_avx512vl(auVar216,auVar216);
          auVar216 = vxorps_avx512vl(auVar217,auVar217);
          if ((0 < iVar134) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar135]);
          }
          if ((0 < iVar134) && (0 < iVar195)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar135]);
          }
          auVar217 = vmaxss_avx512f(ZEXT416((uint)(((fVar246 - fVar248) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = -iVar45 + 1 + iVar192;
          if (iVar112 < iVar94) {
            iVar94 = iVar112;
          }
          iVar196 = iVar94 + -1;
          iVar195 = iVar45 + iVar192;
          if (iVar112 <= iVar45 + iVar192) {
            iVar195 = iVar112;
          }
          auVar220 = vsubss_avx512f(auVar220,auVar215);
          auVar220 = vsubss_avx512f(auVar220,auVar216);
          auVar220 = vaddss_avx512f(auVar220,auVar219);
          fVar246 = 0.0;
          auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
          auVar217 = vfmadd132ss_fma(auVar220,auVar217,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar67) && (0 < iVar94)) {
            fVar248 = pfVar38[iVar136 + iVar196];
          }
          iVar95 = iVar195 + -1;
          if ((0 < iVar67) && (0 < iVar195)) {
            fVar246 = pfVar38[iVar136 + iVar95];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar68) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar137 + iVar196];
          }
          if ((0 < iVar68) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar137 + iVar95];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          if ((0 < iVar203) && (0 < iVar94)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar113 + iVar196]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar203) && (0 < iVar195)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar113 + iVar95]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          if ((0 < iVar69) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar138]);
          }
          if ((0 < iVar69) && (0 < iVar195)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar95 + iVar138]);
          }
          auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = iVar45 + 1 + iVar192;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          auVar232 = vsubss_avx512f(auVar215,auVar219);
          auVar232 = vsubss_avx512f(auVar232,auVar218);
          auVar232 = vaddss_avx512f(auVar232,auVar216);
          fVar246 = 0.0;
          auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x40);
          auVar220 = vfmadd132ss_fma(auVar232,auVar220,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar178) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar139 + iVar121];
          }
          iVar195 = iVar94 + -1;
          if ((0 < iVar178) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar139 + iVar195];
          }
          fVar249 = 0.0;
          if (bVar193) {
            auVar214 = ZEXT416((uint)pfVar38[iVar103 + iVar121]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar103 + iVar195];
          }
          iVar196 = -iVar45 + iVar192;
          if (iVar112 < iVar196) {
            iVar196 = iVar112;
          }
          iVar95 = iVar196 + -1;
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar63) && (0 < iVar196)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if (bVar174) {
            auVar216 = ZEXT416((uint)pfVar38[iVar104 + iVar200]);
          }
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          auVar221 = vxorps_avx512vl(auVar221,auVar221);
          if ((0 < iVar107) && (0 < iVar196)) {
            auVar221 = ZEXT416((uint)pfVar38[iVar140 + iVar95]);
          }
          if ((0 < iVar107) && (0 < iVar207)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar140 + iVar200]);
          }
          auVar223 = vxorps_avx512vl(auVar223,auVar223);
          if ((0 < iVar178) && (0 < iVar196)) {
            auVar223 = ZEXT416((uint)pfVar38[iVar139 + iVar95]);
          }
          auVar224 = vxorps_avx512vl(auVar224,auVar224);
          if ((0 < iVar178) && (0 < iVar207)) {
            auVar224 = ZEXT416((uint)pfVar38[iVar139 + iVar200]);
          }
          auVar225 = vxorps_avx512vl(auVar225,auVar225);
          auVar226 = vxorps_avx512vl(auVar226,auVar226);
          if ((0 < iVar62) && (0 < iVar196)) {
            auVar226 = ZEXT416((uint)pfVar38[iVar95 + iVar103]);
          }
          if (bVar40 && bVar39) {
            auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar200]);
          }
          auVar228 = vxorps_avx512vl(auVar228,auVar228);
          if (bVar42 && bVar41) {
            auVar228 = ZEXT416((uint)pfVar38[iVar104 + iVar121]);
          }
          auVar229 = vxorps_avx512vl(auVar229,auVar229);
          if ((0 < iVar63) && (0 < iVar94)) {
            auVar229 = ZEXT416((uint)pfVar38[iVar104 + iVar195]);
          }
          auVar230 = vxorps_avx512vl(auVar230,auVar230);
          auVar231 = vxorps_avx512vl(auVar231,auVar231);
          if ((0 < iVar107) && (0 < iVar185)) {
            auVar231 = ZEXT416((uint)pfVar38[iVar140 + iVar121]);
          }
          if ((0 < iVar107) && (0 < iVar94)) {
            auVar230 = ZEXT416((uint)pfVar38[iVar195 + iVar140]);
          }
          auVar232 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar214);
          auVar233 = vmaxss_avx512f(ZEXT416((uint)(auVar232._0_4_ + fVar249)),auVar215);
          auVar232 = vsubss_avx512f(auVar219,auVar216);
          auVar232 = vsubss_avx512f(auVar232,auVar221);
          auVar232 = vaddss_avx512f(auVar232,auVar218);
          auVar234 = vmaxss_avx512f(auVar232,auVar222);
          auVar232 = vsubss_avx512f(auVar223,auVar224);
          auVar232 = vsubss_avx512f(auVar232,auVar226);
          auVar232 = vaddss_avx512f(auVar232,auVar225);
          auVar235 = vmaxss_avx512f(auVar232,auVar227);
          auVar232 = vsubss_avx512f(auVar228,auVar229);
          auVar232 = vsubss_avx512f(auVar232,auVar231);
          auVar232 = vaddss_avx512f(auVar232,auVar230);
          fVar248 = 0.0;
          auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x20);
          fVar246 = ((auVar233._0_4_ + auVar234._0_4_) - auVar235._0_4_) - auVar232._0_4_;
          auVar232 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -0.81)),auVar217,auVar220);
          pfVar24[lVar124 + lVar211] = auVar232._0_4_ * fVar239 * fVar239;
          pbVar25[lVar211 + lVar124] = 0.0 <= auVar217._0_4_ + auVar220._0_4_;
          iVar94 = iVar192 - iVar181;
          if (iVar112 < iVar192 - iVar181) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar5 - iVar181) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          fVar246 = 0.0;
          if ((0 < iVar88) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar204 + iVar94 + -1];
          }
          if ((0 < iVar88) && (0 < iVar195)) {
            fVar248 = pfVar38[iVar204 + iVar195 + -1];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar141) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar94 + -1 + iVar142];
          }
          if ((0 < iVar141) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar195 + -1 + iVar142];
          }
          iVar94 = iVar192 - iVar54;
          if (iVar112 < iVar192 - iVar54) {
            iVar94 = iVar112;
          }
          iVar195 = (iVar46 - iVar54) + iVar192;
          if (iVar112 <= iVar195) {
            iVar195 = iVar112;
          }
          auVar214 = vxorps_avx512vl(auVar214,auVar214);
          in_ZMM16 = ZEXT1664(auVar214);
          auVar217._0_12_ = ZEXT812(0);
          auVar217._12_4_ = 0;
          if ((0 < iVar88) && (0 < iVar94)) {
            auVar217 = ZEXT416((uint)pfVar38[iVar204 + iVar94 + -1]);
          }
          if ((0 < iVar88) && (0 < iVar195)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar204 + iVar195 + -1]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          if ((0 < iVar141) && (0 < iVar94)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar142]);
          }
          if ((0 < iVar141) && (0 < iVar195)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar142]);
          }
          auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar246 - fVar248) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = -iVar46 + 1 + iVar192;
          if (iVar112 < iVar94) {
            iVar94 = iVar112;
          }
          iVar196 = iVar94 + -1;
          iVar195 = iVar46 + iVar192;
          if (iVar112 <= iVar46 + iVar192) {
            iVar195 = iVar112;
          }
          auVar217 = vsubss_avx512f(auVar217,auVar215);
          auVar217 = vsubss_avx512f(auVar217,auVar216);
          auVar217 = vaddss_avx512f(auVar217,auVar219);
          fVar246 = 0.0;
          auVar217 = vmaxss_avx(auVar217,ZEXT816(0) << 0x40);
          auVar217 = vfmadd132ss_fma(auVar217,auVar220,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar70) && (0 < iVar94)) {
            fVar248 = pfVar38[iVar143 + iVar196];
          }
          iVar95 = iVar195 + -1;
          if ((0 < iVar70) && (0 < iVar195)) {
            fVar246 = pfVar38[iVar143 + iVar95];
          }
          fVar247 = 0.0;
          fVar249 = 0.0;
          if ((0 < iVar71) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar144 + iVar196];
          }
          if ((0 < iVar71) && (0 < iVar195)) {
            fVar247 = pfVar38[iVar144 + iVar95];
          }
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          if ((0 < iVar114) && (0 < iVar94)) {
            auVar215 = ZEXT416((uint)pfVar38[iVar115 + iVar196]);
          }
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          if ((0 < iVar114) && (0 < iVar195)) {
            auVar219 = ZEXT416((uint)pfVar38[iVar115 + iVar95]);
          }
          auVar216 = vxorps_avx512vl(auVar216,auVar216);
          auVar218 = vxorps_avx512vl(auVar218,auVar218);
          if ((0 < iVar72) && (0 < iVar94)) {
            auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar145]);
          }
          if ((0 < iVar72) && (0 < iVar195)) {
            auVar216 = ZEXT416((uint)pfVar38[iVar95 + iVar145]);
          }
          auVar214 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                    auVar214);
          iVar94 = iVar46 + 1 + iVar192;
          if (iVar112 <= iVar94) {
            iVar94 = iVar112;
          }
          auVar220 = vsubss_avx512f(auVar215,auVar219);
          auVar220 = vsubss_avx512f(auVar220,auVar218);
          auVar220 = vaddss_avx512f(auVar220,auVar216);
          fVar246 = 0.0;
          auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
          auVar214 = vfmadd132ss_fma(auVar220,auVar214,auVar236);
          fVar248 = 0.0;
          if ((0 < iVar179) && (0 < iVar185)) {
            fVar248 = pfVar38[iVar146 + iVar121];
          }
          iVar195 = iVar94 + -1;
          if ((0 < iVar179) && (0 < iVar94)) {
            fVar246 = pfVar38[iVar146 + iVar195];
          }
          fVar249 = 0.0;
          if (bVar193) {
            in_ZMM16 = ZEXT464((uint)pfVar38[iVar103 + iVar121]);
          }
          if ((0 < iVar62) && (0 < iVar94)) {
            fVar249 = pfVar38[iVar103 + iVar195];
          }
          iVar196 = -iVar46 + iVar192;
          if (iVar112 < iVar196) {
            iVar196 = iVar112;
          }
          iVar95 = iVar196 + -1;
          auVar215 = vxorps_avx512vl(auVar215,auVar215);
          auVar219 = vxorps_avx512vl(auVar219,auVar219);
          in_ZMM18 = ZEXT1664(auVar219);
          if ((0 < iVar63) && (0 < iVar196)) {
            in_ZMM18 = ZEXT464((uint)pfVar38[iVar104 + iVar95]);
          }
          auVar219 = vxorps_avx512vl(auVar216,auVar216);
          in_ZMM19 = ZEXT1664(auVar219);
          if (bVar174) {
            in_ZMM19 = ZEXT464((uint)pfVar38[iVar104 + iVar200]);
          }
          auVar219 = vxorps_avx512vl(auVar218,auVar218);
          in_ZMM20 = ZEXT1664(auVar219);
          auVar219 = vxorps_avx512vl(auVar221,auVar221);
          in_ZMM21 = ZEXT1664(auVar219);
          if ((0 < iVar108) && (0 < iVar196)) {
            in_ZMM21 = ZEXT464((uint)pfVar38[iVar147 + iVar95]);
          }
          if ((0 < iVar108) && (0 < iVar207)) {
            in_ZMM20 = ZEXT464((uint)pfVar38[iVar147 + iVar200]);
          }
          auVar219 = vxorps_avx512vl(auVar223,auVar223);
          in_ZMM23 = ZEXT1664(auVar219);
          if ((0 < iVar179) && (0 < iVar196)) {
            in_ZMM23 = ZEXT464((uint)pfVar38[iVar146 + iVar95]);
          }
          auVar219 = vxorps_avx512vl(auVar224,auVar224);
          in_ZMM24 = ZEXT1664(auVar219);
          if ((0 < iVar179) && (0 < iVar207)) {
            in_ZMM24 = ZEXT464((uint)pfVar38[iVar146 + iVar200]);
          }
          auVar219 = vxorps_avx512vl(auVar225,auVar225);
          in_ZMM25 = ZEXT1664(auVar219);
          auVar219 = vxorps_avx512vl(auVar226,auVar226);
          in_ZMM26 = ZEXT1664(auVar219);
          if ((0 < iVar62) && (0 < iVar196)) {
            in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar103]);
          }
          if (bVar40 && bVar39) {
            in_ZMM25 = ZEXT464((uint)pfVar38[iVar103 + iVar200]);
          }
          auVar219 = vxorps_avx512vl(auVar228,auVar228);
          in_ZMM28 = ZEXT1664(auVar219);
          if (bVar42 && bVar41) {
            in_ZMM28 = ZEXT464((uint)pfVar38[iVar104 + iVar121]);
          }
          auVar219 = vxorps_avx512vl(auVar229,auVar229);
          in_ZMM29 = ZEXT1664(auVar219);
          if ((0 < iVar63) && (0 < iVar94)) {
            in_ZMM29 = ZEXT464((uint)pfVar38[iVar104 + iVar195]);
          }
          auVar219 = vxorps_avx512vl(auVar230,auVar230);
          in_ZMM30 = ZEXT1664(auVar219);
          auVar219 = vxorps_avx512vl(auVar231,auVar231);
          in_ZMM31 = ZEXT1664(auVar219);
          if ((0 < iVar108) && (0 < iVar185)) {
            in_ZMM31 = ZEXT464((uint)pfVar38[iVar147 + iVar121]);
          }
          if ((0 < iVar108) && (0 < iVar94)) {
            in_ZMM30 = ZEXT464((uint)pfVar38[iVar195 + iVar147]);
          }
          auVar221 = in_ZMM16._0_16_;
          auVar219 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar221);
          auVar216 = vmaxss_avx512f(ZEXT416((uint)(auVar219._0_4_ + fVar249)),auVar215);
          auVar223 = in_ZMM18._0_16_;
          auVar224 = in_ZMM19._0_16_;
          auVar219 = vsubss_avx512f(auVar223,auVar224);
          auVar226 = in_ZMM21._0_16_;
          auVar219 = vsubss_avx512f(auVar219,auVar226);
          auVar225 = in_ZMM20._0_16_;
          auVar219 = vaddss_avx512f(auVar219,auVar225);
          auVar218 = vmaxss_avx512f(auVar219,auVar222);
          auVar228 = in_ZMM23._0_16_;
          auVar229 = in_ZMM24._0_16_;
          auVar219 = vsubss_avx512f(auVar228,auVar229);
          auVar231 = in_ZMM26._0_16_;
          auVar219 = vsubss_avx512f(auVar219,auVar231);
          auVar230 = in_ZMM25._0_16_;
          auVar219 = vaddss_avx512f(auVar219,auVar230);
          auVar220 = vmaxss_avx512f(auVar219,auVar227);
          auVar232 = in_ZMM28._0_16_;
          auVar233 = in_ZMM29._0_16_;
          auVar219 = vsubss_avx512f(auVar232,auVar233);
          auVar235 = in_ZMM31._0_16_;
          auVar219 = vsubss_avx512f(auVar219,auVar235);
          auVar234 = in_ZMM30._0_16_;
          auVar219 = vaddss_avx512f(auVar219,auVar234);
          auVar219 = vmaxss_avx(auVar219,auVar245);
          fVar248 = ((auVar216._0_4_ + auVar218._0_4_) - auVar220._0_4_) - auVar219._0_4_;
          auVar219 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar248 * -0.81)),auVar217,auVar214);
          pfVar26[lVar124 + lVar211] = auVar219._0_4_ * fVar240 * fVar240;
          pbVar27[lVar211 + lVar124] = 0.0 <= auVar217._0_4_ + auVar214._0_4_;
          if ((((uint)lVar211 | local_74c) & 1) == 0) {
            iVar94 = iVar192 - iVar186;
            if (iVar112 < iVar192 - iVar186) {
              iVar94 = iVar112;
            }
            iVar195 = (iVar6 - iVar186) + iVar192;
            if (iVar112 <= iVar195) {
              iVar195 = iVar112;
            }
            fVar246 = 0.0;
            fVar248 = 0.0;
            if ((0 < iVar89) && (0 < iVar94)) {
              fVar248 = pfVar38[iVar205 + iVar94 + -1];
            }
            if ((0 < iVar89) && (0 < iVar195)) {
              fVar246 = pfVar38[iVar205 + iVar195 + -1];
            }
            fVar247 = 0.0;
            fVar249 = 0.0;
            if ((0 < iVar148) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar94 + -1 + iVar149];
            }
            if ((0 < iVar148) && (0 < iVar195)) {
              fVar247 = pfVar38[iVar195 + -1 + iVar149];
            }
            iVar94 = iVar192 - iVar55;
            if (iVar112 < iVar192 - iVar55) {
              iVar94 = iVar112;
            }
            iVar195 = (iVar47 - iVar55) + iVar192;
            if (iVar112 <= iVar195) {
              iVar195 = iVar112;
            }
            auVar214 = vxorps_avx512vl(auVar221,auVar221);
            auVar219 = ZEXT816(0) << 0x40;
            if ((0 < iVar89) && (0 < iVar94)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar205 + iVar94 + -1]);
            }
            if ((0 < iVar89) && (0 < iVar195)) {
              auVar215 = ZEXT416((uint)pfVar38[iVar205 + iVar195 + -1]);
            }
            auVar216 = vxorps_avx512vl(auVar223,auVar223);
            auVar217 = vxorps_avx512vl(auVar224,auVar224);
            if ((0 < iVar148) && (0 < iVar94)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar149]);
            }
            if ((0 < iVar148) && (0 < iVar195)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar149]);
            }
            auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                      auVar214);
            iVar94 = -iVar47 + 1 + iVar192;
            if (iVar112 < iVar94) {
              iVar94 = iVar112;
            }
            iVar196 = iVar94 + -1;
            iVar195 = iVar47 + iVar192;
            if (iVar112 <= iVar47 + iVar192) {
              iVar195 = iVar112;
            }
            auVar219 = vsubss_avx512f(auVar219,auVar215);
            auVar219 = vsubss_avx512f(auVar219,auVar217);
            auVar219 = vaddss_avx512f(auVar219,auVar216);
            fVar246 = 0.0;
            auVar219 = vmaxss_avx(auVar219,ZEXT816(0) << 0x40);
            auVar219 = vfmadd132ss_fma(auVar219,auVar218,auVar236);
            fVar248 = 0.0;
            if ((0 < iVar73) && (0 < iVar94)) {
              fVar248 = pfVar38[iVar150 + iVar196];
            }
            iVar95 = iVar195 + -1;
            if ((0 < iVar73) && (0 < iVar195)) {
              fVar246 = pfVar38[iVar150 + iVar95];
            }
            fVar247 = 0.0;
            fVar249 = 0.0;
            if ((0 < iVar74) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar151 + iVar196];
            }
            if ((0 < iVar74) && (0 < iVar195)) {
              fVar247 = pfVar38[iVar151 + iVar95];
            }
            auVar215 = vxorps_avx512vl(auVar215,auVar215);
            if ((0 < iVar180) && (0 < iVar94)) {
              auVar215 = ZEXT416((uint)pfVar38[iVar212 + iVar196]);
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            if ((0 < iVar180) && (0 < iVar195)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar212 + iVar95]);
            }
            auVar217 = vxorps_avx512vl(auVar217,auVar217);
            auVar218 = vxorps_avx512vl(auVar225,auVar225);
            if ((0 < iVar75) && (0 < iVar94)) {
              auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar152]);
            }
            if ((0 < iVar75) && (0 < iVar195)) {
              auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar152]);
            }
            auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                      auVar214);
            iVar94 = iVar47 + 1 + iVar192;
            if (iVar112 <= iVar94) {
              iVar94 = iVar112;
            }
            auVar221 = vsubss_avx512f(auVar215,auVar216);
            auVar221 = vsubss_avx512f(auVar221,auVar218);
            auVar221 = vaddss_avx512f(auVar221,auVar217);
            fVar246 = 0.0;
            auVar221 = vmaxss_avx(auVar221,ZEXT816(0) << 0x40);
            auVar220 = vfmadd132ss_fma(auVar221,auVar220,auVar236);
            fVar248 = 0.0;
            if ((0 < iVar116) && (0 < iVar185)) {
              fVar248 = pfVar38[iVar153 + iVar121];
            }
            iVar195 = iVar94 + -1;
            if ((0 < iVar116) && (0 < iVar94)) {
              fVar246 = pfVar38[iVar153 + iVar195];
            }
            fVar249 = 0.0;
            if (bVar193) {
              auVar214 = ZEXT416((uint)pfVar38[iVar103 + iVar121]);
            }
            if ((0 < iVar62) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar103 + iVar195];
            }
            iVar196 = -iVar47 + iVar192;
            if (iVar112 < iVar196) {
              iVar196 = iVar112;
            }
            iVar95 = iVar196 + -1;
            auVar215 = vxorps_avx512vl(auVar215,auVar215);
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            if ((0 < iVar63) && (0 < iVar196)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
            }
            auVar217 = vxorps_avx512vl(auVar217,auVar217);
            if (bVar174) {
              auVar217 = ZEXT416((uint)pfVar38[iVar104 + iVar200]);
            }
            auVar218 = vxorps_avx512vl(auVar218,auVar218);
            auVar221 = vxorps_avx512vl(auVar226,auVar226);
            if ((0 < iVar109) && (0 < iVar196)) {
              auVar221 = ZEXT416((uint)pfVar38[iVar154 + iVar95]);
            }
            if ((0 < iVar109) && (0 < iVar207)) {
              auVar218 = ZEXT416((uint)pfVar38[iVar154 + iVar200]);
            }
            auVar223 = vxorps_avx512vl(auVar228,auVar228);
            if ((0 < iVar116) && (0 < iVar196)) {
              auVar223 = ZEXT416((uint)pfVar38[iVar153 + iVar95]);
            }
            auVar224 = vxorps_avx512vl(auVar229,auVar229);
            if ((0 < iVar116) && (0 < iVar207)) {
              auVar224 = ZEXT416((uint)pfVar38[iVar153 + iVar200]);
            }
            auVar225 = vxorps_avx512vl(auVar230,auVar230);
            auVar226 = vxorps_avx512vl(auVar231,auVar231);
            if ((0 < iVar62) && (0 < iVar196)) {
              auVar226 = ZEXT416((uint)pfVar38[iVar95 + iVar103]);
            }
            if (bVar40 && bVar39) {
              auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar200]);
            }
            auVar228 = vxorps_avx512vl(auVar232,auVar232);
            if (bVar42 && bVar41) {
              auVar228 = ZEXT416((uint)pfVar38[iVar104 + iVar121]);
            }
            auVar229 = vxorps_avx512vl(auVar233,auVar233);
            if ((0 < iVar63) && (0 < iVar94)) {
              auVar229 = ZEXT416((uint)pfVar38[iVar104 + iVar195]);
            }
            auVar230 = vxorps_avx512vl(auVar234,auVar234);
            auVar231 = vxorps_avx512vl(auVar235,auVar235);
            if ((0 < iVar109) && (0 < iVar185)) {
              auVar231 = ZEXT416((uint)pfVar38[iVar154 + iVar121]);
            }
            if ((0 < iVar109) && (0 < iVar94)) {
              auVar230 = ZEXT416((uint)pfVar38[iVar195 + iVar154]);
            }
            auVar232 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar214);
            auVar233 = vmaxss_avx512f(ZEXT416((uint)(auVar232._0_4_ + fVar249)),auVar215);
            auVar232 = vsubss_avx512f(auVar216,auVar217);
            auVar232 = vsubss_avx512f(auVar232,auVar221);
            auVar232 = vaddss_avx512f(auVar232,auVar218);
            auVar234 = vmaxss_avx512f(auVar232,auVar222);
            auVar232 = vsubss_avx512f(auVar223,auVar224);
            auVar232 = vsubss_avx512f(auVar232,auVar226);
            auVar232 = vaddss_avx512f(auVar232,auVar225);
            auVar235 = vmaxss_avx512f(auVar232,auVar227);
            auVar232 = vsubss_avx512f(auVar228,auVar229);
            auVar232 = vsubss_avx512f(auVar232,auVar231);
            auVar232 = vaddss_avx512f(auVar232,auVar230);
            fVar248 = 0.0;
            auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x20);
            fVar246 = ((auVar233._0_4_ + auVar234._0_4_) - auVar235._0_4_) - auVar232._0_4_;
            auVar232 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -0.81)),auVar219,auVar220)
            ;
            pfVar28[iVar122] = auVar232._0_4_ * fVar241 * fVar241;
            pbVar29[iVar122] = 0.0 <= auVar219._0_4_ + auVar220._0_4_;
            iVar94 = iVar192 - iVar194;
            if (iVar112 < iVar192 - iVar194) {
              iVar94 = iVar112;
            }
            iVar195 = (iVar7 - iVar194) + iVar192;
            if (iVar112 <= iVar195) {
              iVar195 = iVar112;
            }
            fVar246 = 0.0;
            if ((0 < iVar90) && (0 < iVar94)) {
              fVar246 = pfVar38[iVar206 + iVar94 + -1];
            }
            if ((0 < iVar90) && (0 < iVar195)) {
              fVar248 = pfVar38[iVar206 + iVar195 + -1];
            }
            fVar247 = 0.0;
            fVar249 = 0.0;
            if ((0 < iVar155) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar94 + -1 + iVar156];
            }
            if ((0 < iVar155) && (0 < iVar195)) {
              fVar247 = pfVar38[iVar195 + -1 + iVar156];
            }
            iVar94 = iVar192 - iVar56;
            if (iVar112 < iVar192 - iVar56) {
              iVar94 = iVar112;
            }
            iVar195 = (iVar48 - iVar56) + iVar192;
            if (iVar112 <= iVar195) {
              iVar195 = iVar112;
            }
            auVar214 = vxorps_avx512vl(auVar214,auVar214);
            in_ZMM16 = ZEXT1664(auVar214);
            auVar232._0_12_ = ZEXT812(0);
            auVar232._12_4_ = 0;
            if ((0 < iVar90) && (0 < iVar94)) {
              auVar232 = ZEXT416((uint)pfVar38[iVar206 + iVar94 + -1]);
            }
            if ((0 < iVar90) && (0 < iVar195)) {
              auVar215 = ZEXT416((uint)pfVar38[iVar206 + iVar195 + -1]);
            }
            auVar219 = vxorps_avx512vl(auVar216,auVar216);
            auVar216 = vxorps_avx512vl(auVar217,auVar217);
            if ((0 < iVar155) && (0 < iVar94)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar156]);
            }
            if ((0 < iVar155) && (0 < iVar195)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar156]);
            }
            auVar217 = vmaxss_avx512f(ZEXT416((uint)(((fVar246 - fVar248) - fVar249) + fVar247)),
                                      auVar214);
            iVar94 = -iVar48 + 1 + iVar192;
            if (iVar112 < iVar94) {
              iVar94 = iVar112;
            }
            iVar196 = iVar94 + -1;
            iVar195 = iVar48 + iVar192;
            if (iVar112 <= iVar48 + iVar192) {
              iVar195 = iVar112;
            }
            auVar220 = vsubss_avx512f(auVar232,auVar215);
            auVar220 = vsubss_avx512f(auVar220,auVar216);
            auVar220 = vaddss_avx512f(auVar220,auVar219);
            fVar246 = 0.0;
            auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
            auVar217 = vfmadd132ss_fma(auVar220,auVar217,auVar236);
            fVar248 = 0.0;
            if ((0 < iVar76) && (0 < iVar94)) {
              fVar248 = pfVar38[iVar157 + iVar196];
            }
            iVar95 = iVar195 + -1;
            if ((0 < iVar76) && (0 < iVar195)) {
              fVar246 = pfVar38[iVar157 + iVar95];
            }
            fVar247 = 0.0;
            fVar249 = 0.0;
            if ((0 < iVar77) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar158 + iVar196];
            }
            if ((0 < iVar77) && (0 < iVar195)) {
              fVar247 = pfVar38[iVar158 + iVar95];
            }
            auVar215 = vxorps_avx512vl(auVar215,auVar215);
            if ((0 < iVar210) && (0 < iVar94)) {
              auVar215 = ZEXT416((uint)pfVar38[iVar198 + iVar196]);
            }
            auVar219 = vxorps_avx512vl(auVar219,auVar219);
            if ((0 < iVar210) && (0 < iVar195)) {
              auVar219 = ZEXT416((uint)pfVar38[iVar198 + iVar95]);
            }
            auVar216 = vxorps_avx512vl(auVar216,auVar216);
            auVar218 = vxorps_avx512vl(auVar218,auVar218);
            if ((0 < iVar78) && (0 < iVar94)) {
              auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar159]);
            }
            if ((0 < iVar78) && (0 < iVar195)) {
              auVar216 = ZEXT416((uint)pfVar38[iVar95 + iVar159]);
            }
            auVar214 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                      auVar214);
            iVar94 = iVar48 + 1 + iVar192;
            if (iVar112 <= iVar94) {
              iVar94 = iVar112;
            }
            auVar220 = vsubss_avx512f(auVar215,auVar219);
            auVar220 = vsubss_avx512f(auVar220,auVar218);
            auVar220 = vaddss_avx512f(auVar220,auVar216);
            fVar246 = 0.0;
            auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
            auVar214 = vfmadd132ss_fma(auVar220,auVar214,auVar236);
            fVar248 = 0.0;
            if ((0 < iVar117) && (0 < iVar185)) {
              fVar248 = pfVar38[iVar160 + iVar121];
            }
            iVar195 = iVar94 + -1;
            if ((0 < iVar117) && (0 < iVar94)) {
              fVar246 = pfVar38[iVar160 + iVar195];
            }
            fVar249 = 0.0;
            if (bVar193) {
              in_ZMM16 = ZEXT464((uint)pfVar38[iVar103 + iVar121]);
            }
            if ((0 < iVar62) && (0 < iVar94)) {
              fVar249 = pfVar38[iVar103 + iVar195];
            }
            iVar196 = -iVar48 + iVar192;
            if (iVar112 < iVar196) {
              iVar196 = iVar112;
            }
            iVar95 = iVar196 + -1;
            auVar215 = vxorps_avx512vl(auVar215,auVar215);
            auVar219 = vxorps_avx512vl(auVar219,auVar219);
            in_ZMM18 = ZEXT1664(auVar219);
            if ((0 < iVar63) && (0 < iVar196)) {
              in_ZMM18 = ZEXT464((uint)pfVar38[iVar104 + iVar95]);
            }
            auVar219 = vxorps_avx512vl(auVar216,auVar216);
            in_ZMM19 = ZEXT1664(auVar219);
            if (bVar174) {
              in_ZMM19 = ZEXT464((uint)pfVar38[iVar104 + iVar200]);
            }
            auVar219 = vxorps_avx512vl(auVar218,auVar218);
            in_ZMM20 = ZEXT1664(auVar219);
            auVar219 = vxorps_avx512vl(auVar221,auVar221);
            in_ZMM21 = ZEXT1664(auVar219);
            if ((0 < iVar110) && (0 < iVar196)) {
              in_ZMM21 = ZEXT464((uint)pfVar38[iVar161 + iVar95]);
            }
            if ((0 < iVar110) && (0 < iVar207)) {
              in_ZMM20 = ZEXT464((uint)pfVar38[iVar161 + iVar200]);
            }
            auVar219 = vxorps_avx512vl(auVar223,auVar223);
            in_ZMM23 = ZEXT1664(auVar219);
            if ((0 < iVar117) && (0 < iVar196)) {
              in_ZMM23 = ZEXT464((uint)pfVar38[iVar160 + iVar95]);
            }
            auVar219 = vxorps_avx512vl(auVar224,auVar224);
            in_ZMM24 = ZEXT1664(auVar219);
            if ((0 < iVar117) && (0 < iVar207)) {
              in_ZMM24 = ZEXT464((uint)pfVar38[iVar160 + iVar200]);
            }
            auVar219 = vxorps_avx512vl(auVar225,auVar225);
            in_ZMM25 = ZEXT1664(auVar219);
            auVar219 = vxorps_avx512vl(auVar226,auVar226);
            in_ZMM26 = ZEXT1664(auVar219);
            if ((0 < iVar62) && (0 < iVar196)) {
              in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar103]);
            }
            if (bVar40 && bVar39) {
              in_ZMM25 = ZEXT464((uint)pfVar38[iVar103 + iVar200]);
            }
            auVar219 = vxorps_avx512vl(auVar228,auVar228);
            in_ZMM28 = ZEXT1664(auVar219);
            if (bVar42 && bVar41) {
              in_ZMM28 = ZEXT464((uint)pfVar38[iVar104 + iVar121]);
            }
            auVar219 = vxorps_avx512vl(auVar229,auVar229);
            in_ZMM29 = ZEXT1664(auVar219);
            if ((0 < iVar63) && (0 < iVar94)) {
              in_ZMM29 = ZEXT464((uint)pfVar38[iVar104 + iVar195]);
            }
            auVar219 = vxorps_avx512vl(auVar230,auVar230);
            in_ZMM30 = ZEXT1664(auVar219);
            auVar219 = vxorps_avx512vl(auVar231,auVar231);
            in_ZMM31 = ZEXT1664(auVar219);
            if ((0 < iVar110) && (0 < iVar185)) {
              in_ZMM31 = ZEXT464((uint)pfVar38[iVar161 + iVar121]);
            }
            if ((0 < iVar110) && (0 < iVar94)) {
              in_ZMM30 = ZEXT464((uint)pfVar38[iVar195 + iVar161]);
            }
            auVar221 = in_ZMM16._0_16_;
            auVar219 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar221);
            auVar216 = vmaxss_avx512f(ZEXT416((uint)(auVar219._0_4_ + fVar249)),auVar215);
            auVar223 = in_ZMM18._0_16_;
            auVar224 = in_ZMM19._0_16_;
            auVar219 = vsubss_avx512f(auVar223,auVar224);
            auVar226 = in_ZMM21._0_16_;
            auVar219 = vsubss_avx512f(auVar219,auVar226);
            auVar225 = in_ZMM20._0_16_;
            auVar219 = vaddss_avx512f(auVar219,auVar225);
            auVar218 = vmaxss_avx512f(auVar219,auVar222);
            auVar228 = in_ZMM23._0_16_;
            auVar229 = in_ZMM24._0_16_;
            auVar219 = vsubss_avx512f(auVar228,auVar229);
            auVar231 = in_ZMM26._0_16_;
            auVar219 = vsubss_avx512f(auVar219,auVar231);
            auVar230 = in_ZMM25._0_16_;
            auVar219 = vaddss_avx512f(auVar219,auVar230);
            auVar220 = vmaxss_avx512f(auVar219,auVar227);
            auVar232 = in_ZMM28._0_16_;
            auVar233 = in_ZMM29._0_16_;
            auVar219 = vsubss_avx512f(auVar232,auVar233);
            auVar235 = in_ZMM31._0_16_;
            auVar219 = vsubss_avx512f(auVar219,auVar235);
            auVar234 = in_ZMM30._0_16_;
            auVar219 = vaddss_avx512f(auVar219,auVar234);
            auVar219 = vmaxss_avx(auVar219,auVar245);
            fVar248 = ((auVar216._0_4_ + auVar218._0_4_) - auVar220._0_4_) - auVar219._0_4_;
            auVar219 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar248 * -0.81)),auVar217,auVar214)
            ;
            pfVar30[iVar122] = auVar219._0_4_ * fVar242 * fVar242;
            pbVar31[iVar122] = 0.0 <= auVar217._0_4_ + auVar214._0_4_;
            iVar122 = iVar122 + 1;
            if ((((uint)lVar211 | local_74c) & 2) == 0) {
              iVar94 = iVar192 - iVar197;
              if (iVar112 < iVar192 - iVar197) {
                iVar94 = iVar112;
              }
              iVar195 = (iVar8 - iVar197) + iVar192;
              if (iVar112 <= iVar195) {
                iVar195 = iVar112;
              }
              fVar246 = 0.0;
              fVar248 = 0.0;
              if ((0 < iVar91) && (0 < iVar94)) {
                fVar248 = pfVar38[iVar199 + iVar94 + -1];
              }
              if ((0 < iVar91) && (0 < iVar195)) {
                fVar246 = pfVar38[iVar199 + iVar195 + -1];
              }
              fVar247 = 0.0;
              fVar249 = 0.0;
              if ((0 < iVar162) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar94 + -1 + iVar163];
              }
              if ((0 < iVar162) && (0 < iVar195)) {
                fVar247 = pfVar38[iVar195 + -1 + iVar163];
              }
              iVar94 = iVar192 - iVar57;
              if (iVar112 < iVar192 - iVar57) {
                iVar94 = iVar112;
              }
              iVar195 = (iVar49 - iVar57) + iVar192;
              if (iVar112 <= iVar195) {
                iVar195 = iVar112;
              }
              auVar214 = vxorps_avx512vl(auVar221,auVar221);
              auVar219 = ZEXT816(0) << 0x40;
              if ((0 < iVar91) && (0 < iVar94)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar199 + iVar94 + -1]);
              }
              if ((0 < iVar91) && (0 < iVar195)) {
                auVar215 = ZEXT416((uint)pfVar38[iVar199 + iVar195 + -1]);
              }
              auVar216 = vxorps_avx512vl(auVar223,auVar223);
              auVar217 = vxorps_avx512vl(auVar224,auVar224);
              if ((0 < iVar162) && (0 < iVar94)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar163]);
              }
              if ((0 < iVar162) && (0 < iVar195)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar163]);
              }
              auVar218 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                        auVar214);
              iVar94 = -iVar49 + 1 + iVar192;
              if (iVar112 < iVar94) {
                iVar94 = iVar112;
              }
              iVar196 = iVar94 + -1;
              iVar195 = iVar49 + iVar192;
              if (iVar112 <= iVar49 + iVar192) {
                iVar195 = iVar112;
              }
              auVar219 = vsubss_avx512f(auVar219,auVar215);
              auVar219 = vsubss_avx512f(auVar219,auVar217);
              auVar219 = vaddss_avx512f(auVar219,auVar216);
              fVar246 = 0.0;
              auVar219 = vmaxss_avx(auVar219,ZEXT816(0) << 0x40);
              auVar219 = vfmadd132ss_fma(auVar219,auVar218,auVar236);
              fVar248 = 0.0;
              if ((0 < iVar79) && (0 < iVar94)) {
                fVar248 = pfVar38[iVar164 + iVar196];
              }
              iVar95 = iVar195 + -1;
              if ((0 < iVar79) && (0 < iVar195)) {
                fVar246 = pfVar38[iVar164 + iVar95];
              }
              fVar247 = 0.0;
              fVar249 = 0.0;
              if ((0 < iVar80) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar165 + iVar196];
              }
              if ((0 < iVar80) && (0 < iVar195)) {
                fVar247 = pfVar38[iVar165 + iVar95];
              }
              auVar215 = vxorps_avx512vl(auVar215,auVar215);
              if ((0 < iVar213) && (0 < iVar94)) {
                auVar215 = ZEXT416((uint)pfVar38[iVar190 + iVar196]);
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              if ((0 < iVar213) && (0 < iVar195)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar190 + iVar95]);
              }
              auVar217 = vxorps_avx512vl(auVar217,auVar217);
              auVar218 = vxorps_avx512vl(auVar225,auVar225);
              if ((0 < iVar81) && (0 < iVar94)) {
                auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar166]);
              }
              if ((0 < iVar81) && (0 < iVar195)) {
                auVar217 = ZEXT416((uint)pfVar38[iVar95 + iVar166]);
              }
              auVar220 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                        auVar214);
              iVar94 = iVar49 + 1 + iVar192;
              if (iVar112 <= iVar94) {
                iVar94 = iVar112;
              }
              auVar221 = vsubss_avx512f(auVar215,auVar216);
              auVar221 = vsubss_avx512f(auVar221,auVar218);
              auVar221 = vaddss_avx512f(auVar221,auVar217);
              fVar246 = 0.0;
              auVar221 = vmaxss_avx(auVar221,ZEXT816(0) << 0x40);
              auVar220 = vfmadd132ss_fma(auVar221,auVar220,auVar236);
              fVar248 = 0.0;
              if ((0 < iVar118) && (0 < iVar185)) {
                fVar248 = pfVar38[iVar167 + iVar121];
              }
              iVar195 = iVar94 + -1;
              if ((0 < iVar118) && (0 < iVar94)) {
                fVar246 = pfVar38[iVar167 + iVar195];
              }
              fVar249 = 0.0;
              if (bVar193) {
                auVar214 = ZEXT416((uint)pfVar38[iVar103 + iVar121]);
              }
              if ((0 < iVar62) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar103 + iVar195];
              }
              iVar196 = -iVar49 + iVar192;
              if (iVar112 < iVar196) {
                iVar196 = iVar112;
              }
              iVar95 = iVar196 + -1;
              auVar215 = vxorps_avx512vl(auVar215,auVar215);
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              if ((0 < iVar63) && (0 < iVar196)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar104 + iVar95]);
              }
              auVar217 = vxorps_avx512vl(auVar217,auVar217);
              if (bVar174) {
                auVar217 = ZEXT416((uint)pfVar38[iVar104 + iVar200]);
              }
              auVar218 = vxorps_avx512vl(auVar218,auVar218);
              auVar221 = vxorps_avx512vl(auVar226,auVar226);
              if ((0 < iVar111) && (0 < iVar196)) {
                auVar221 = ZEXT416((uint)pfVar38[iVar168 + iVar95]);
              }
              if ((0 < iVar111) && (0 < iVar207)) {
                auVar218 = ZEXT416((uint)pfVar38[iVar168 + iVar200]);
              }
              auVar223 = vxorps_avx512vl(auVar228,auVar228);
              if ((0 < iVar118) && (0 < iVar196)) {
                auVar223 = ZEXT416((uint)pfVar38[iVar167 + iVar95]);
              }
              auVar224 = vxorps_avx512vl(auVar229,auVar229);
              if ((0 < iVar118) && (0 < iVar207)) {
                auVar224 = ZEXT416((uint)pfVar38[iVar167 + iVar200]);
              }
              auVar225 = vxorps_avx512vl(auVar230,auVar230);
              auVar226 = vxorps_avx512vl(auVar231,auVar231);
              if ((0 < iVar62) && (0 < iVar196)) {
                auVar226 = ZEXT416((uint)pfVar38[iVar95 + iVar103]);
              }
              if (bVar40 && bVar39) {
                auVar225 = ZEXT416((uint)pfVar38[iVar103 + iVar200]);
              }
              auVar228 = vxorps_avx512vl(auVar232,auVar232);
              if (bVar42 && bVar41) {
                auVar228 = ZEXT416((uint)pfVar38[iVar104 + iVar121]);
              }
              auVar229 = vxorps_avx512vl(auVar233,auVar233);
              if ((0 < iVar63) && (0 < iVar94)) {
                auVar229 = ZEXT416((uint)pfVar38[iVar104 + iVar195]);
              }
              auVar230 = vxorps_avx512vl(auVar234,auVar234);
              auVar231 = vxorps_avx512vl(auVar235,auVar235);
              if ((0 < iVar111) && (0 < iVar185)) {
                auVar231 = ZEXT416((uint)pfVar38[iVar168 + iVar121]);
              }
              if ((0 < iVar111) && (0 < iVar94)) {
                auVar230 = ZEXT416((uint)pfVar38[iVar195 + iVar168]);
              }
              auVar232 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),auVar214);
              auVar233 = vmaxss_avx512f(ZEXT416((uint)(auVar232._0_4_ + fVar249)),auVar215);
              auVar232 = vsubss_avx512f(auVar216,auVar217);
              auVar232 = vsubss_avx512f(auVar232,auVar221);
              auVar232 = vaddss_avx512f(auVar232,auVar218);
              auVar234 = vmaxss_avx512f(auVar232,auVar222);
              auVar232 = vsubss_avx512f(auVar223,auVar224);
              auVar232 = vsubss_avx512f(auVar232,auVar226);
              auVar232 = vaddss_avx512f(auVar232,auVar225);
              auVar235 = vmaxss_avx512f(auVar232,auVar227);
              auVar232 = vsubss_avx512f(auVar228,auVar229);
              auVar232 = vsubss_avx512f(auVar232,auVar231);
              auVar232 = vaddss_avx512f(auVar232,auVar230);
              fVar248 = 0.0;
              auVar232 = vmaxss_avx(auVar232,ZEXT816(0) << 0x20);
              fVar246 = ((auVar233._0_4_ + auVar234._0_4_) - auVar235._0_4_) - auVar232._0_4_;
              auVar232 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -0.81)),auVar219,
                                         auVar220);
              pfVar32[iVar123] = auVar232._0_4_ * fVar243 * fVar243;
              pbVar33[iVar123] = 0.0 <= auVar219._0_4_ + auVar220._0_4_;
              iVar94 = iVar192 - iVar93;
              if (iVar112 < iVar192 - iVar93) {
                iVar94 = iVar112;
              }
              iVar195 = (iVar9 - iVar93) + iVar192;
              if (iVar112 <= iVar195) {
                iVar195 = iVar112;
              }
              fVar246 = 0.0;
              if ((0 < iVar92) && (0 < iVar94)) {
                fVar246 = pfVar38[iVar191 + iVar94 + -1];
              }
              if ((0 < iVar92) && (0 < iVar195)) {
                fVar248 = pfVar38[iVar191 + iVar195 + -1];
              }
              fVar247 = 0.0;
              fVar249 = 0.0;
              if ((0 < iVar169) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar94 + -1 + iVar170];
              }
              if ((0 < iVar169) && (0 < iVar195)) {
                fVar247 = pfVar38[iVar195 + -1 + iVar170];
              }
              iVar94 = iVar192 - iVar58;
              if (iVar112 < iVar192 - iVar58) {
                iVar94 = iVar112;
              }
              iVar195 = (iVar50 - iVar58) + iVar192;
              if (iVar112 <= iVar195) {
                iVar195 = iVar112;
              }
              auVar214 = vxorps_avx512vl(auVar214,auVar214);
              in_ZMM16 = ZEXT1664(auVar214);
              auVar233._0_12_ = ZEXT812(0);
              auVar233._12_4_ = 0;
              if ((0 < iVar92) && (0 < iVar94)) {
                auVar233 = ZEXT416((uint)pfVar38[iVar191 + iVar94 + -1]);
              }
              if ((0 < iVar92) && (0 < iVar195)) {
                auVar215 = ZEXT416((uint)pfVar38[iVar191 + iVar195 + -1]);
              }
              auVar219 = vxorps_avx512vl(auVar216,auVar216);
              auVar216 = vxorps_avx512vl(auVar217,auVar217);
              if ((0 < iVar169) && (0 < iVar94)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar94 + -1 + iVar170]);
              }
              if ((0 < iVar169) && (0 < iVar195)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar195 + -1 + iVar170]);
              }
              auVar217 = vmaxss_avx512f(ZEXT416((uint)(((fVar246 - fVar248) - fVar249) + fVar247)),
                                        auVar214);
              iVar94 = -iVar50 + 1 + iVar192;
              if (iVar112 < iVar94) {
                iVar94 = iVar112;
              }
              iVar196 = iVar94 + -1;
              iVar195 = iVar50 + iVar192;
              if (iVar112 <= iVar50 + iVar192) {
                iVar195 = iVar112;
              }
              auVar220 = vsubss_avx512f(auVar233,auVar215);
              auVar220 = vsubss_avx512f(auVar220,auVar216);
              auVar220 = vaddss_avx512f(auVar220,auVar219);
              fVar246 = 0.0;
              auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
              auVar217 = vfmadd132ss_fma(auVar220,auVar217,auVar236);
              fVar248 = 0.0;
              if ((0 < iVar82) && (0 < iVar94)) {
                fVar248 = pfVar38[iVar171 + iVar196];
              }
              iVar95 = iVar195 + -1;
              if ((0 < iVar82) && (0 < iVar195)) {
                fVar246 = pfVar38[iVar171 + iVar95];
              }
              fVar247 = 0.0;
              fVar249 = 0.0;
              if ((0 < iVar83) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar172 + iVar196];
              }
              if ((0 < iVar83) && (0 < iVar195)) {
                fVar247 = pfVar38[iVar172 + iVar95];
              }
              auVar215 = vxorps_avx512vl(auVar215,auVar215);
              if ((0 < iVar209) && (0 < iVar94)) {
                auVar215 = ZEXT416((uint)pfVar38[iVar173 + iVar196]);
              }
              auVar219 = vxorps_avx512vl(auVar219,auVar219);
              if ((0 < iVar209) && (0 < iVar195)) {
                auVar219 = ZEXT416((uint)pfVar38[iVar173 + iVar95]);
              }
              auVar216 = vxorps_avx512vl(auVar216,auVar216);
              auVar218 = vxorps_avx512vl(auVar218,auVar218);
              if ((0 < iVar84) && (0 < iVar94)) {
                auVar218 = ZEXT416((uint)pfVar38[iVar196 + iVar126]);
              }
              if ((0 < iVar84) && (0 < iVar195)) {
                auVar216 = ZEXT416((uint)pfVar38[iVar95 + iVar126]);
              }
              auVar214 = vmaxss_avx512f(ZEXT416((uint)(((fVar248 - fVar246) - fVar249) + fVar247)),
                                        auVar214);
              iVar94 = iVar50 + 1 + iVar192;
              if (iVar112 <= iVar94) {
                iVar94 = iVar112;
              }
              auVar220 = vsubss_avx512f(auVar215,auVar219);
              auVar220 = vsubss_avx512f(auVar220,auVar218);
              auVar220 = vaddss_avx512f(auVar220,auVar216);
              fVar246 = 0.0;
              auVar220 = vmaxss_avx(auVar220,ZEXT816(0) << 0x40);
              auVar214 = vfmadd132ss_fma(auVar220,auVar214,auVar236);
              fVar248 = 0.0;
              if ((0 < iVar184) && (0 < iVar185)) {
                fVar248 = pfVar38[iVar119 + iVar121];
              }
              iVar195 = iVar94 + -1;
              if ((0 < iVar184) && (0 < iVar94)) {
                fVar246 = pfVar38[iVar119 + iVar195];
              }
              fVar249 = 0.0;
              if (bVar193) {
                in_ZMM16 = ZEXT464((uint)pfVar38[iVar103 + iVar121]);
              }
              if ((0 < iVar62) && (0 < iVar94)) {
                fVar249 = pfVar38[iVar103 + iVar195];
              }
              iVar196 = -iVar50 + iVar192;
              if (iVar112 < iVar196) {
                iVar196 = iVar112;
              }
              iVar95 = iVar196 + -1;
              auVar215 = vxorps_avx512vl(auVar215,auVar215);
              auVar219 = vxorps_avx512vl(auVar219,auVar219);
              in_ZMM18 = ZEXT1664(auVar219);
              if ((0 < iVar63) && (0 < iVar196)) {
                in_ZMM18 = ZEXT464((uint)pfVar38[iVar104 + iVar95]);
              }
              auVar219 = vxorps_avx512vl(auVar216,auVar216);
              in_ZMM19 = ZEXT1664(auVar219);
              if (bVar174) {
                in_ZMM19 = ZEXT464((uint)pfVar38[iVar104 + iVar200]);
              }
              auVar219 = vxorps_avx512vl(auVar218,auVar218);
              in_ZMM20 = ZEXT1664(auVar219);
              auVar219 = vxorps_avx512vl(auVar221,auVar221);
              in_ZMM21 = ZEXT1664(auVar219);
              if ((0 < iVar12) && (0 < iVar196)) {
                in_ZMM21 = ZEXT464((uint)pfVar38[iVar120 + iVar95]);
              }
              if ((0 < iVar12) && (0 < iVar207)) {
                in_ZMM20 = ZEXT464((uint)pfVar38[iVar120 + iVar200]);
              }
              auVar219 = vxorps_avx512vl(auVar223,auVar223);
              in_ZMM23 = ZEXT1664(auVar219);
              if ((0 < iVar184) && (0 < iVar196)) {
                in_ZMM23 = ZEXT464((uint)pfVar38[iVar119 + iVar95]);
              }
              auVar219 = vxorps_avx512vl(auVar224,auVar224);
              in_ZMM24 = ZEXT1664(auVar219);
              if ((0 < iVar184) && (0 < iVar207)) {
                in_ZMM24 = ZEXT464((uint)pfVar38[iVar119 + iVar200]);
              }
              auVar219 = vxorps_avx512vl(auVar225,auVar225);
              in_ZMM25 = ZEXT1664(auVar219);
              auVar219 = vxorps_avx512vl(auVar226,auVar226);
              in_ZMM26 = ZEXT1664(auVar219);
              if ((0 < iVar62) && (0 < iVar196)) {
                in_ZMM26 = ZEXT464((uint)pfVar38[iVar95 + iVar103]);
              }
              if (bVar40 && bVar39) {
                in_ZMM25 = ZEXT464((uint)pfVar38[iVar200 + iVar103]);
              }
              auVar219 = vxorps_avx512vl(auVar228,auVar228);
              in_ZMM28 = ZEXT1664(auVar219);
              if (bVar42 && bVar41) {
                in_ZMM28 = ZEXT464((uint)pfVar38[iVar104 + iVar121]);
              }
              auVar219 = vxorps_avx512vl(auVar229,auVar229);
              in_ZMM29 = ZEXT1664(auVar219);
              if ((0 < iVar63) && (0 < iVar94)) {
                in_ZMM29 = ZEXT464((uint)pfVar38[iVar104 + iVar195]);
              }
              auVar219 = vxorps_avx512vl(auVar230,auVar230);
              in_ZMM30 = ZEXT1664(auVar219);
              auVar219 = vxorps_avx512vl(auVar231,auVar231);
              in_ZMM31 = ZEXT1664(auVar219);
              if ((0 < iVar12) && (0 < iVar185)) {
                in_ZMM31 = ZEXT464((uint)pfVar38[iVar121 + iVar120]);
              }
              if ((0 < iVar12) && (0 < iVar94)) {
                in_ZMM30 = ZEXT464((uint)pfVar38[iVar195 + iVar120]);
              }
              auVar219 = vsubss_avx512f(ZEXT416((uint)(fVar248 - fVar246)),in_ZMM16._0_16_);
              auVar216 = vmaxss_avx512f(ZEXT416((uint)(auVar219._0_4_ + fVar249)),auVar215);
              auVar219 = vsubss_avx512f(in_ZMM18._0_16_,in_ZMM19._0_16_);
              auVar219 = vsubss_avx512f(auVar219,in_ZMM21._0_16_);
              auVar219 = vaddss_avx512f(auVar219,in_ZMM20._0_16_);
              auVar218 = vmaxss_avx512f(auVar219,auVar222);
              auVar219 = vsubss_avx512f(in_ZMM23._0_16_,in_ZMM24._0_16_);
              auVar219 = vsubss_avx512f(auVar219,in_ZMM26._0_16_);
              auVar219 = vaddss_avx512f(auVar219,in_ZMM25._0_16_);
              auVar236 = vmaxss_avx512f(auVar219,auVar227);
              auVar219 = vsubss_avx512f(in_ZMM28._0_16_,in_ZMM29._0_16_);
              auVar219 = vsubss_avx512f(auVar219,in_ZMM31._0_16_);
              auVar219 = vaddss_avx512f(auVar219,in_ZMM30._0_16_);
              auVar219 = vmaxss_avx(auVar219,auVar245);
              fVar248 = ((auVar216._0_4_ + auVar218._0_4_) - auVar236._0_4_) - auVar219._0_4_;
              auVar219 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar248 * -0.81)),auVar217,
                                         auVar214);
              pfVar34[iVar123] = auVar219._0_4_ * fVar244 * fVar244;
              pbVar35[iVar123] = 0.0 <= auVar217._0_4_ + auVar214._0_4_;
              iVar123 = iVar123 + 1;
            }
          }
          in_ZMM17 = ZEXT1664(auVar215);
          lVar211 = lVar211 + 1;
          iVar192 = iVar192 + iVar10;
        } while (iVar11 != (int)lVar211);
        local_688 = local_688 + (int)lVar211;
      }
      local_74c = local_74c + 1;
    } while (local_74c != uVar1);
  }
  return;
}

Assistant:

void compute_response_layers_at_once(struct fasthessian* fh) {
    /*
    TODO: (valentin) add index precomputation as in compute_response_layer_precompute

    optimizations:
        - precompute inv_area_squared as in compute_response_layer_precompute
        - computes all 8 response layers at once, gives same results as base implementation


    Results:
        - slower than before :(
        - valgrind reports no improvement for l1 misses, i.e. locality is not improved as expected
            guess due to different filter sizes always accesing different cachelines
            need to be smarter about computation order to gain benefit (i.e. same mem addresses are actually accessed at once)
    */
    float Dxx0, Dyy0, Dxy0;
    float Dxx1, Dyy1, Dxy1;
    float Dxx2, Dyy2, Dxy2;
    float Dxx3, Dyy3, Dxy3;
    float Dxx4, Dyy4, Dxy4;
    float Dxx5, Dyy5, Dxy5;
    float Dxx6, Dyy6, Dxy6;
    float Dxx7, Dyy7, Dxy7;

    int x, y;
    int step = fh->step;
    struct integral_image* iimage = fh->iimage;

    // step == 1: 0,1,2,3
    // step == 2: 4,5
    // step == 4: 6,7

    struct response_layer *layer0 = fh->response_map[0];  // step0 == step
    struct response_layer *layer1 = fh->response_map[1];  // step1 == step
    struct response_layer *layer2 = fh->response_map[2];  // step2 == step
    struct response_layer *layer3 = fh->response_map[3];  // step3 == step

    struct response_layer *layer4 = fh->response_map[4];  // step4 == 2*step
    struct response_layer *layer5 = fh->response_map[5];  // step5 == 2*step

    struct response_layer *layer6 = fh->response_map[6];  // step6 == 4*step
    struct response_layer *layer7 = fh->response_map[7];  // step7 == 4*step

    float *response0 = layer0->response;
    float *response1 = layer1->response;
    float *response2 = layer2->response;
    float *response3 = layer3->response;
    float *response4 = layer4->response;
    float *response5 = layer5->response;
    float *response6 = layer6->response;
    float *response7 = layer7->response;

    bool *laplacian0 = layer0->laplacian;
    bool *laplacian1 = layer1->laplacian;
    bool *laplacian2 = layer2->laplacian;
    bool *laplacian3 = layer3->laplacian;
    bool *laplacian4 = layer4->laplacian;
    bool *laplacian5 = layer5->laplacian;
    bool *laplacian6 = layer6->laplacian;
    bool *laplacian7 = layer7->laplacian;

    int filter_size0 = layer0->filter_size;
    int filter_size1 = layer1->filter_size;
    int filter_size2 = layer2->filter_size;
    int filter_size3 = layer3->filter_size;
    int filter_size4 = layer4->filter_size;
    int filter_size5 = layer5->filter_size;
    int filter_size6 = layer6->filter_size;
    int filter_size7 = layer7->filter_size;

    int height = layer0->height;
    int width = layer0->width;

    int lobe0 = filter_size0/3;
    int lobe1 = filter_size1/3;
    int lobe2 = filter_size2/3;
    int lobe3 = filter_size3/3;
    int lobe4 = filter_size4/3;
    int lobe5 = filter_size5/3;
    int lobe6 = filter_size6/3;
    int lobe7 = filter_size7/3;

    int border0 = (filter_size0-1)/2;
    int border1 = (filter_size1-1)/2;
    int border2 = (filter_size2-1)/2;
    int border3 = (filter_size3-1)/2;
    int border4 = (filter_size4-1)/2;
    int border5 = (filter_size5-1)/2;
    int border6 = (filter_size6-1)/2;
    int border7 = (filter_size7-1)/2;

    float inv_area0 = 1.f/(filter_size0*filter_size0);
    float inv_area1 = 1.f/(filter_size1*filter_size1);
    float inv_area2 = 1.f/(filter_size2*filter_size2);
    float inv_area3 = 1.f/(filter_size3*filter_size3);
    float inv_area4 = 1.f/(filter_size4*filter_size4);
    float inv_area5 = 1.f/(filter_size5*filter_size5);
    float inv_area6 = 1.f/(filter_size6*filter_size6);
    float inv_area7 = 1.f/(filter_size7*filter_size7);

    float inv_area_squared0 = (inv_area0*inv_area0);
    float inv_area_squared1 = (inv_area1*inv_area1);
    float inv_area_squared2 = (inv_area2*inv_area2);
    float inv_area_squared3 = (inv_area3*inv_area3);
    float inv_area_squared4 = (inv_area4*inv_area4);
    float inv_area_squared5 = (inv_area5*inv_area5);
    float inv_area_squared6 = (inv_area6*inv_area6);
    float inv_area_squared7 = (inv_area7*inv_area7);


    for (int i = 0, ind = 0, ind2 = 0, ind4 = 0; i < height; ++i) {
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            x = i * step;
            y = j * step;

            // layer0
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx0 = box_integral(iimage, x - lobe0 + 1, y - border0, 2 * lobe0 - 1, filter_size0) -
                   3 * box_integral(iimage, x - lobe0 + 1, y - lobe0 / 2, 2 * lobe0 - 1, lobe0);
            Dyy0 = box_integral(iimage, x - border0, y - lobe0 + 1, filter_size0, 2 * lobe0 - 1) -
                   3 * box_integral(iimage, x - lobe0 / 2, y - lobe0 + 1, lobe0, 2 * lobe0 - 1);
            Dxy0 = box_integral(iimage, x - lobe0, y + 1, lobe0, lobe0) +
                   box_integral(iimage, x + 1, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x - lobe0, y - lobe0, lobe0, lobe0) -
                   box_integral(iimage, x + 1, y + 1, lobe0, lobe0);

            // Normalize Responses with inverse area
            // Dxx0 *= inv_area0;
            // Dyy0 *= inv_area0;
            // Dxy0 *= inv_area0;

            // Calculate Determinant
            response0[ind] = inv_area_squared0*(Dxx0 * Dyy0 - 0.81f * Dxy0 * Dxy0);

            // Calculate Laplacian
            laplacian0[ind] = (Dxx0 + Dyy0 >= 0 ? true : false);


            // layer1
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx1 = box_integral(iimage, x - lobe1 + 1, y - border1, 2 * lobe1 - 1, filter_size1) -
                   3 * box_integral(iimage, x - lobe1 + 1, y - lobe1 / 2, 2 * lobe1 - 1, lobe1);
            Dyy1 = box_integral(iimage, x - border1, y - lobe1 + 1, filter_size1, 2 * lobe1 - 1) -
                   3 * box_integral(iimage, x - lobe1 / 2, y - lobe1 + 1, lobe1, 2 * lobe1 - 1);
            Dxy1 = box_integral(iimage, x - lobe1, y + 1, lobe1, lobe1) +
                   box_integral(iimage, x + 1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x - lobe1, y - lobe1, lobe1, lobe1) -
                   box_integral(iimage, x + 1, y + 1, lobe1, lobe1);

            // Normalize Responses with inverse area
            // Dxx1 *= inv_area1;
            // Dyy1 *= inv_area1;
            // Dxy1 *= inv_area1;

            // Calculate Determinant
            response1[ind] = inv_area_squared1*(Dxx1 * Dyy1 - 0.81f * Dxy1 * Dxy1);

            // Calculate Laplacian
            laplacian1[ind] = (Dxx1 + Dyy1 >= 0 ? true : false);


            // layer2
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx2 = box_integral(iimage, x - lobe2 + 1, y - border2, 2 * lobe2 - 1, filter_size2) -
                   3 * box_integral(iimage, x - lobe2 + 1, y - lobe2 / 2, 2 * lobe2 - 1, lobe2);
            Dyy2 = box_integral(iimage, x - border2, y - lobe2 + 1, filter_size2, 2 * lobe2 - 1) -
                   3 * box_integral(iimage, x - lobe2 / 2, y - lobe2 + 1, lobe2, 2 * lobe2 - 1);
            Dxy2 = box_integral(iimage, x - lobe2, y + 1, lobe2, lobe2) +
                   box_integral(iimage, x + 1, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x - lobe2, y - lobe2, lobe2, lobe2) -
                   box_integral(iimage, x + 1, y + 1, lobe2, lobe2);

            // Normalize Responses with inverse area
            // Dxx2 *= inv_area2;
            // Dyy2 *= inv_area2;
            // Dxy2 *= inv_area2;

            // Calculate Determinant
            response2[ind] = inv_area_squared2*(Dxx2 * Dyy2 - 0.81f * Dxy2 * Dxy2);

            // Calculate Laplacian
            laplacian2[ind] = (Dxx2 + Dyy2 >= 0 ? true : false);


            // layer3
            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx3 = box_integral(iimage, x - lobe3 + 1, y - border3, 2*lobe3 - 1, filter_size3)
                    - 3 * box_integral(iimage, x - lobe3 + 1, y - lobe3 / 2, 2*lobe3 - 1, lobe3);
            Dyy3 = box_integral(iimage, x - border3, y - lobe3 + 1, filter_size3, 2*lobe3 - 1)
                    - 3 * box_integral(iimage, x - lobe3 / 2, y - lobe3 + 1, lobe3, 2*lobe3 - 1);
            Dxy3 = box_integral(iimage, x - lobe3, y + 1, lobe3, lobe3)
                    + box_integral(iimage, x + 1, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x - lobe3, y - lobe3, lobe3, lobe3)
                    - box_integral(iimage, x + 1, y + 1, lobe3, lobe3);

            // Normalize Responses with inverse area
            // Dxx3 *= inv_area3;
            // Dyy3 *= inv_area3;
            // Dxy3 *= inv_area3;

            // Calculate Determinant
            response3[ind] = inv_area_squared3*(Dxx3 * Dyy3 - 0.81f * Dxy3 * Dxy3);

            // Calculate Laplacian
            laplacian3[ind] = (Dxx3 + Dyy3 >= 0 ? true : false);


            // 2*step
            if (i % 2 == 0 && j % 2 == 0) {
                // layer4
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx4 = box_integral(iimage, x - lobe4 + 1, y - border4, 2*lobe4 - 1, filter_size4)
                        - 3 * box_integral(iimage, x - lobe4 + 1, y - lobe4 / 2, 2*lobe4 - 1, lobe4);
                Dyy4 = box_integral(iimage, x - border4, y - lobe4 + 1, filter_size4, 2*lobe4 - 1)
                        - 3 * box_integral(iimage, x - lobe4 / 2, y - lobe4 + 1, lobe4, 2*lobe4 - 1);
                Dxy4 = box_integral(iimage, x - lobe4, y + 1, lobe4, lobe4)
                        + box_integral(iimage, x + 1, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x - lobe4, y - lobe4, lobe4, lobe4)
                        - box_integral(iimage, x + 1, y + 1, lobe4, lobe4);

                // Normalize Responses with inverse area
                // Dxx4 *= inv_area4;
                // Dyy4 *= inv_area4;
                // Dxy4 *= inv_area4;

                // Calculate Determinant
                response4[ind2] = inv_area_squared4*(Dxx4 * Dyy4 - 0.81f * Dxy4 * Dxy4);

                // Calculate Laplacian
                laplacian4[ind2] = (Dxx4 + Dyy4 >= 0 ? true : false);


                // layer5
                // Calculate Dxx, Dyy, Dxy with Box Filter
                Dxx5 = box_integral(iimage, x - lobe5 + 1, y - border5, 2*lobe5 - 1, filter_size5)
                        - 3 * box_integral(iimage, x - lobe5 + 1, y - lobe5 / 2, 2*lobe5 - 1, lobe5);
                Dyy5 = box_integral(iimage, x - border5, y - lobe5 + 1, filter_size5, 2*lobe5 - 1)
                        - 3 * box_integral(iimage, x - lobe5 / 2, y - lobe5 + 1, lobe5, 2*lobe5 - 1);
                Dxy5 = box_integral(iimage, x - lobe5, y + 1, lobe5, lobe5)
                        + box_integral(iimage, x + 1, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x - lobe5, y - lobe5, lobe5, lobe5)
                        - box_integral(iimage, x + 1, y + 1, lobe5, lobe5);

                // Normalize Responses with inverse area
                // Dxx5 *= inv_area5;
                // Dyy5 *= inv_area5;
                // Dxy5 *= inv_area5;

                // Calculate Determinant
                response5[ind2] = inv_area_squared5*(Dxx5 * Dyy5 - 0.81f * Dxy5 * Dxy5);

                // Calculate Laplacian
                laplacian5[ind2] = (Dxx5 + Dyy5 >= 0 ? true : false);


                ind2++;

                // 4*step
                if (i % 4 == 0 && j % 4 == 0) {
                    // layer6
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx6 = box_integral(iimage, x - lobe6 + 1, y - border6, 2*lobe6 - 1, filter_size6)
                            - 3 * box_integral(iimage, x - lobe6 + 1, y - lobe6 / 2, 2*lobe6 - 1, lobe6);
                    Dyy6 = box_integral(iimage, x - border6, y - lobe6 + 1, filter_size6, 2*lobe6 - 1)
                            - 3 * box_integral(iimage, x - lobe6 / 2, y - lobe6 + 1, lobe6, 2*lobe6 - 1);
                    Dxy6 = box_integral(iimage, x - lobe6, y + 1, lobe6, lobe6)
                            + box_integral(iimage, x + 1, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x - lobe6, y - lobe6, lobe6, lobe6)
                            - box_integral(iimage, x + 1, y + 1, lobe6, lobe6);

                    // Normalize Responses with inverse area
                    // Dxx6 *= inv_area6;
                    // Dyy6 *= inv_area6;
                    // Dxy6 *= inv_area6;

                    // Calculate Determinant
                    response6[ind4] = inv_area_squared6*(Dxx6 * Dyy6 - 0.81f * Dxy6 * Dxy6);

                    // Calculate Laplacian
                    laplacian6[ind4] = (Dxx6 + Dyy6 >= 0 ? true : false);


                    // layer7
                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    Dxx7 = box_integral(iimage, x - lobe7 + 1, y - border7, 2*lobe7 - 1, filter_size7)
                            - 3 * box_integral(iimage, x - lobe7 + 1, y - lobe7 / 2, 2*lobe7 - 1, lobe7);
                    Dyy7 = box_integral(iimage, x - border7, y - lobe7 + 1, filter_size7, 2*lobe7 - 1)
                            - 3 * box_integral(iimage, x - lobe7 / 2, y - lobe7 + 1, lobe7, 2*lobe7 - 1);
                    Dxy7 = box_integral(iimage, x - lobe7, y + 1, lobe7, lobe7)
                            + box_integral(iimage, x + 1, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x - lobe7, y - lobe7, lobe7, lobe7)
                            - box_integral(iimage, x + 1, y + 1, lobe7, lobe7);

                    // Normalize Responses with inverse area
                    // Dxx7 *= inv_area7;
                    // Dyy7 *= inv_area7;
                    // Dxy7 *= inv_area7;

                    // Calculate Determinant
                    response7[ind4] = inv_area_squared7*(Dxx7 * Dyy7 - 0.81f * Dxy7 * Dxy7);

                    // Calculate Laplacian
                    laplacian7[ind4] = (Dxx7 + Dyy7 >= 0 ? true : false);


                    ind4++;
                }
            }

            // template for search and replace J to layer number
            // // layerJ
            // // Calculate Dxx, Dyy, Dxy with Box Filter
            // DxxJ = box_integral(iimage, x - lobeJ + 1, y - borderJ, 2*lobeJ - 1, filter_sizeJ)
            //         - 3 * box_integral(iimage, x - lobeJ + 1, y - lobeJ / 2, 2*lobeJ - 1, lobeJ);
            // DyyJ = box_integral(iimage, x - borderJ, y - lobeJ + 1, filter_sizeJ, 2*lobeJ - 1)
            //         - 3 * box_integral(iimage, x - lobeJ / 2, y - lobeJ + 1, lobeJ, 2*lobeJ - 1);
            // DxyJ = box_integral(iimage, x - lobeJ, y + 1, lobeJ, lobeJ)
            //         + box_integral(iimage, x + 1, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x - lobeJ, y - lobeJ, lobeJ, lobeJ)
            //         - box_integral(iimage, x + 1, y + 1, lobeJ, lobeJ);

            // // Normalize Responses with inverse area
            // DxxJ *= inv_areaJ;
            // DyyJ *= inv_areaJ;
            // DxyJ *= inv_areaJ;

            // // Calculate Determinant
            // responseJ[ind] = DxxJ * DyyJ - 0.81f * DxyJ * DxyJ;

            // // Calculate Laplacian
            // laplacianJ[ind] = (DxxJ + DyyJ >= 0 ? true : false);
        }
    }

}